

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiIntersector1<8>::
     occluded_t<embree::avx512::SweepCurve1Intersector1<embree::CatmullRomCurveT>,embree::avx512::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  Primitive PVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  int iVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [12];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  byte bVar68;
  ulong uVar69;
  byte bVar70;
  byte bVar71;
  byte bVar72;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  ulong uVar73;
  byte bVar74;
  ulong unaff_R13;
  long lVar75;
  bool bVar76;
  bool bVar77;
  ulong uVar78;
  uint uVar79;
  uint uVar132;
  uint uVar133;
  uint uVar135;
  uint uVar136;
  uint uVar137;
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  uint uVar134;
  uint uVar138;
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  float pp;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  float fVar154;
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  float fVar172;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  float fVar191;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [64];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 in_ZMM4 [64];
  undefined4 uVar213;
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  float fVar217;
  float fVar218;
  float fVar219;
  float fVar220;
  float fVar221;
  float fVar222;
  undefined1 auVar216 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [16];
  undefined1 auVar226 [64];
  float t;
  float fVar227;
  float fVar229;
  float fVar230;
  float fVar231;
  float fVar232;
  float fVar233;
  float fVar234;
  float fVar235;
  undefined1 auVar228 [64];
  float fVar236;
  float s;
  undefined1 auVar237 [32];
  undefined1 auVar238 [64];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [64];
  undefined1 auVar242 [32];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  undefined1 auVar246 [64];
  undefined1 auVar247 [64];
  undefined1 auVar248 [64];
  undefined1 auVar249 [64];
  undefined1 auVar250 [64];
  undefined1 auVar251 [64];
  undefined1 auVar252 [64];
  undefined1 auVar253 [64];
  undefined1 auVar254 [64];
  undefined1 auVar255 [64];
  RTCFilterFunctionNArguments args;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  StackEntry stack [3];
  int local_904;
  undefined1 local_900 [32];
  ulong local_8d0;
  ulong local_8c8;
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_850 [16];
  undefined1 local_840 [16];
  undefined1 local_830 [16];
  ulong local_818;
  uint local_80c;
  uint local_808;
  undefined4 local_804;
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  RTCFilterFunctionNArguments local_750;
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined8 local_5f0;
  undefined4 local_5e8;
  float local_5e4;
  undefined4 local_5e0;
  undefined4 local_5dc;
  undefined4 local_5d8;
  uint local_5d4;
  uint local_5d0;
  Primitive *local_5b8;
  ulong local_5b0;
  ulong local_5a8;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [16];
  float local_4a0;
  float fStack_49c;
  float fStack_498;
  float fStack_494;
  undefined1 local_490 [16];
  undefined1 local_480 [16];
  undefined1 local_470 [16];
  undefined1 local_460 [16];
  undefined1 local_450 [16];
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [32];
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined4 local_340;
  undefined4 uStack_33c;
  undefined4 uStack_338;
  undefined4 uStack_334;
  undefined4 uStack_330;
  undefined4 uStack_32c;
  undefined4 uStack_328;
  undefined4 uStack_324;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  undefined4 local_1a0;
  undefined4 uStack_19c;
  undefined4 uStack_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  undefined4 uStack_188;
  undefined4 uStack_184;
  byte abStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  undefined1 auVar117 [32];
  undefined1 auVar126 [32];
  undefined1 auVar129 [32];
  
  PVar5 = prim[1];
  uVar69 = (ulong)(byte)PVar5;
  fVar222 = *(float *)(prim + uVar69 * 0x19 + 0x12);
  auVar87 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + uVar69 * 0x19 + 6));
  fVar172 = fVar222 * (ray->dir).field_0.m128[0];
  fVar191 = fVar222 * auVar87._0_4_;
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar69 * 4 + 6);
  auVar94 = vpmovsxbd_avx2(auVar82);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar69 * 5 + 6);
  auVar95 = vpmovsxbd_avx2(auVar83);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar69 * 6 + 6);
  auVar97 = vpmovsxbd_avx2(auVar80);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + uVar69 * 0xb + 6);
  auVar96 = vpmovsxbd_avx2(auVar3);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar5 * 0xc) + 6);
  auVar98 = vpmovsxbd_avx2(auVar81);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + (uint)(byte)PVar5 * 0xc + uVar69 + 6);
  auVar99 = vpmovsxbd_avx2(auVar84);
  auVar99 = vcvtdq2ps_avx(auVar99);
  uVar78 = (ulong)(uint)((int)(uVar69 * 9) * 2);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar78 + 6);
  auVar100 = vpmovsxbd_avx2(auVar85);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar78 + uVar69 + 6);
  auVar92 = vpmovsxbd_avx2(auVar4);
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar238 = ZEXT3264(auVar100);
  auVar101 = vcvtdq2ps_avx(auVar92);
  auVar241 = ZEXT3264(auVar101);
  uVar73 = (ulong)(uint)((int)(uVar69 * 5) << 2);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar73 + 6);
  auVar102 = vpmovsxbd_avx2(auVar86);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar108._4_4_ = fVar172;
  auVar108._0_4_ = fVar172;
  auVar108._8_4_ = fVar172;
  auVar108._12_4_ = fVar172;
  auVar108._16_4_ = fVar172;
  auVar108._20_4_ = fVar172;
  auVar108._24_4_ = fVar172;
  auVar108._28_4_ = fVar172;
  auVar88 = vbroadcastss_avx512vl(ZEXT416(1));
  auVar93 = ZEXT1632(CONCAT412(fVar222 * (ray->dir).field_0.m128[3],
                               CONCAT48(fVar222 * (ray->dir).field_0.m128[2],
                                        CONCAT44(fVar222 * (ray->dir).field_0.m128[1],fVar172))));
  auVar89 = vpermps_avx512vl(auVar88,auVar93);
  auVar90 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar91 = vpermps_avx512vl(auVar90,auVar93);
  fVar172 = auVar91._0_4_;
  auVar252._0_4_ = fVar172 * auVar97._0_4_;
  fVar217 = auVar91._4_4_;
  auVar252._4_4_ = fVar217 * auVar97._4_4_;
  fVar218 = auVar91._8_4_;
  auVar252._8_4_ = fVar218 * auVar97._8_4_;
  fVar219 = auVar91._12_4_;
  auVar252._12_4_ = fVar219 * auVar97._12_4_;
  fVar220 = auVar91._16_4_;
  auVar252._16_4_ = fVar220 * auVar97._16_4_;
  fVar221 = auVar91._20_4_;
  auVar252._20_4_ = fVar221 * auVar97._20_4_;
  fVar154 = auVar91._24_4_;
  auVar252._28_36_ = in_ZMM4._28_36_;
  auVar252._24_4_ = fVar154 * auVar97._24_4_;
  auVar93._4_4_ = auVar99._4_4_ * fVar217;
  auVar93._0_4_ = auVar99._0_4_ * fVar172;
  auVar93._8_4_ = auVar99._8_4_ * fVar218;
  auVar93._12_4_ = auVar99._12_4_ * fVar219;
  auVar93._16_4_ = auVar99._16_4_ * fVar220;
  auVar93._20_4_ = auVar99._20_4_ * fVar221;
  auVar93._24_4_ = auVar99._24_4_ * fVar154;
  auVar93._28_4_ = auVar92._28_4_;
  auVar92._4_4_ = auVar102._4_4_ * fVar217;
  auVar92._0_4_ = auVar102._0_4_ * fVar172;
  auVar92._8_4_ = auVar102._8_4_ * fVar218;
  auVar92._12_4_ = auVar102._12_4_ * fVar219;
  auVar92._16_4_ = auVar102._16_4_ * fVar220;
  auVar92._20_4_ = auVar102._20_4_ * fVar221;
  auVar92._24_4_ = auVar102._24_4_ * fVar154;
  auVar92._28_4_ = auVar91._28_4_;
  auVar82 = vfmadd231ps_fma(auVar252._0_32_,auVar89,auVar95);
  auVar83 = vfmadd231ps_fma(auVar93,auVar89,auVar98);
  auVar80 = vfmadd231ps_fma(auVar92,auVar101,auVar89);
  auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar108,auVar94);
  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar108,auVar96);
  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar100,auVar108);
  auVar109._4_4_ = fVar191;
  auVar109._0_4_ = fVar191;
  auVar109._8_4_ = fVar191;
  auVar109._12_4_ = fVar191;
  auVar109._16_4_ = fVar191;
  auVar109._20_4_ = fVar191;
  auVar109._24_4_ = fVar191;
  auVar109._28_4_ = fVar191;
  auVar93 = ZEXT1632(CONCAT412(fVar222 * auVar87._12_4_,
                               CONCAT48(fVar222 * auVar87._8_4_,
                                        CONCAT44(fVar222 * auVar87._4_4_,fVar191))));
  auVar92 = vpermps_avx512vl(auVar88,auVar93);
  auVar93 = vpermps_avx512vl(auVar90,auVar93);
  fVar222 = auVar93._0_4_;
  fVar172 = auVar93._4_4_;
  auVar88._4_4_ = fVar172 * auVar97._4_4_;
  auVar88._0_4_ = fVar222 * auVar97._0_4_;
  fVar217 = auVar93._8_4_;
  auVar88._8_4_ = fVar217 * auVar97._8_4_;
  fVar218 = auVar93._12_4_;
  auVar88._12_4_ = fVar218 * auVar97._12_4_;
  fVar219 = auVar93._16_4_;
  auVar88._16_4_ = fVar219 * auVar97._16_4_;
  fVar220 = auVar93._20_4_;
  auVar88._20_4_ = fVar220 * auVar97._20_4_;
  fVar221 = auVar93._24_4_;
  auVar88._24_4_ = fVar221 * auVar97._24_4_;
  auVar88._28_4_ = auVar97._28_4_;
  auVar104._0_4_ = auVar99._0_4_ * fVar222;
  auVar104._4_4_ = auVar99._4_4_ * fVar172;
  auVar104._8_4_ = auVar99._8_4_ * fVar217;
  auVar104._12_4_ = auVar99._12_4_ * fVar218;
  auVar104._16_4_ = auVar99._16_4_ * fVar219;
  auVar104._20_4_ = auVar99._20_4_ * fVar220;
  auVar104._24_4_ = auVar99._24_4_ * fVar221;
  auVar104._28_4_ = 0;
  auVar99._4_4_ = auVar102._4_4_ * fVar172;
  auVar99._0_4_ = auVar102._0_4_ * fVar222;
  auVar99._8_4_ = auVar102._8_4_ * fVar217;
  auVar99._12_4_ = auVar102._12_4_ * fVar218;
  auVar99._16_4_ = auVar102._16_4_ * fVar219;
  auVar99._20_4_ = auVar102._20_4_ * fVar220;
  auVar99._24_4_ = auVar102._24_4_ * fVar221;
  auVar99._28_4_ = auVar93._28_4_;
  auVar3 = vfmadd231ps_fma(auVar88,auVar92,auVar95);
  auVar81 = vfmadd231ps_fma(auVar104,auVar92,auVar98);
  auVar84 = vfmadd231ps_fma(auVar99,auVar92,auVar101);
  auVar3 = vfmadd231ps_fma(ZEXT1632(auVar3),auVar109,auVar94);
  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar109,auVar96);
  auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar109,auVar100);
  auVar94 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar252 = ZEXT3264(auVar94);
  vandps_avx512vl(ZEXT1632(auVar82),auVar94);
  auVar106._8_4_ = 0x219392ef;
  auVar106._0_8_ = 0x219392ef219392ef;
  auVar106._12_4_ = 0x219392ef;
  auVar106._16_4_ = 0x219392ef;
  auVar106._20_4_ = 0x219392ef;
  auVar106._24_4_ = 0x219392ef;
  auVar106._28_4_ = 0x219392ef;
  uVar78 = vcmpps_avx512vl(auVar94,auVar106,1);
  bVar77 = (bool)((byte)uVar78 & 1);
  auVar89._0_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar82._0_4_;
  bVar77 = (bool)((byte)(uVar78 >> 1) & 1);
  auVar89._4_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar82._4_4_;
  bVar77 = (bool)((byte)(uVar78 >> 2) & 1);
  auVar89._8_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar82._8_4_;
  bVar77 = (bool)((byte)(uVar78 >> 3) & 1);
  auVar89._12_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar82._12_4_;
  auVar89._16_4_ = (uint)((byte)(uVar78 >> 4) & 1) * 0x219392ef;
  auVar89._20_4_ = (uint)((byte)(uVar78 >> 5) & 1) * 0x219392ef;
  auVar89._24_4_ = (uint)((byte)(uVar78 >> 6) & 1) * 0x219392ef;
  auVar89._28_4_ = (uint)(byte)(uVar78 >> 7) * 0x219392ef;
  vandps_avx512vl(ZEXT1632(auVar83),auVar94);
  uVar78 = vcmpps_avx512vl(auVar89,auVar106,1);
  bVar77 = (bool)((byte)uVar78 & 1);
  auVar90._0_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar83._0_4_;
  bVar77 = (bool)((byte)(uVar78 >> 1) & 1);
  auVar90._4_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar83._4_4_;
  bVar77 = (bool)((byte)(uVar78 >> 2) & 1);
  auVar90._8_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar83._8_4_;
  bVar77 = (bool)((byte)(uVar78 >> 3) & 1);
  auVar90._12_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar83._12_4_;
  auVar90._16_4_ = (uint)((byte)(uVar78 >> 4) & 1) * 0x219392ef;
  auVar90._20_4_ = (uint)((byte)(uVar78 >> 5) & 1) * 0x219392ef;
  auVar90._24_4_ = (uint)((byte)(uVar78 >> 6) & 1) * 0x219392ef;
  auVar90._28_4_ = (uint)(byte)(uVar78 >> 7) * 0x219392ef;
  vandps_avx512vl(ZEXT1632(auVar80),auVar94);
  uVar78 = vcmpps_avx512vl(auVar90,auVar106,1);
  bVar77 = (bool)((byte)uVar78 & 1);
  auVar94._0_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar80._0_4_;
  bVar77 = (bool)((byte)(uVar78 >> 1) & 1);
  auVar94._4_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar80._4_4_;
  bVar77 = (bool)((byte)(uVar78 >> 2) & 1);
  auVar94._8_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar80._8_4_;
  bVar77 = (bool)((byte)(uVar78 >> 3) & 1);
  auVar94._12_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar80._12_4_;
  auVar94._16_4_ = (uint)((byte)(uVar78 >> 4) & 1) * 0x219392ef;
  auVar94._20_4_ = (uint)((byte)(uVar78 >> 5) & 1) * 0x219392ef;
  auVar94._24_4_ = (uint)((byte)(uVar78 >> 6) & 1) * 0x219392ef;
  auVar94._28_4_ = (uint)(byte)(uVar78 >> 7) * 0x219392ef;
  auVar95 = vrcp14ps_avx512vl(auVar89);
  auVar107._8_4_ = 0x3f800000;
  auVar107._0_8_ = &DAT_3f8000003f800000;
  auVar107._12_4_ = 0x3f800000;
  auVar107._16_4_ = 0x3f800000;
  auVar107._20_4_ = 0x3f800000;
  auVar107._24_4_ = 0x3f800000;
  auVar107._28_4_ = 0x3f800000;
  auVar82 = vfnmadd213ps_fma(auVar89,auVar95,auVar107);
  auVar82 = vfmadd132ps_fma(ZEXT1632(auVar82),auVar95,auVar95);
  auVar95 = vrcp14ps_avx512vl(auVar90);
  auVar83 = vfnmadd213ps_fma(auVar90,auVar95,auVar107);
  auVar83 = vfmadd132ps_fma(ZEXT1632(auVar83),auVar95,auVar95);
  auVar95 = vrcp14ps_avx512vl(auVar94);
  auVar80 = vfnmadd213ps_fma(auVar94,auVar95,auVar107);
  auVar80 = vfmadd132ps_fma(ZEXT1632(auVar80),auVar95,auVar95);
  auVar94 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar69 * 7 + 6));
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar94 = vsubps_avx(auVar94,ZEXT1632(auVar3));
  auVar95 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar69 * 9 + 6));
  auVar100._4_4_ = auVar82._4_4_ * auVar94._4_4_;
  auVar100._0_4_ = auVar82._0_4_ * auVar94._0_4_;
  auVar100._8_4_ = auVar82._8_4_ * auVar94._8_4_;
  auVar100._12_4_ = auVar82._12_4_ * auVar94._12_4_;
  auVar100._16_4_ = auVar94._16_4_ * 0.0;
  auVar100._20_4_ = auVar94._20_4_ * 0.0;
  auVar100._24_4_ = auVar94._24_4_ * 0.0;
  auVar100._28_4_ = auVar94._28_4_;
  auVar94 = vcvtdq2ps_avx(auVar95);
  auVar94 = vsubps_avx(auVar94,ZEXT1632(auVar3));
  auVar105._0_4_ = auVar82._0_4_ * auVar94._0_4_;
  auVar105._4_4_ = auVar82._4_4_ * auVar94._4_4_;
  auVar105._8_4_ = auVar82._8_4_ * auVar94._8_4_;
  auVar105._12_4_ = auVar82._12_4_ * auVar94._12_4_;
  auVar105._16_4_ = auVar94._16_4_ * 0.0;
  auVar105._20_4_ = auVar94._20_4_ * 0.0;
  auVar105._24_4_ = auVar94._24_4_ * 0.0;
  auVar105._28_4_ = 0;
  auVar95 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar5 * 0x10 + 6));
  auVar94 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar5 * 0x10 + uVar69 * -2 + 6));
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar94 = vsubps_avx(auVar94,ZEXT1632(auVar81));
  auVar101._4_4_ = auVar83._4_4_ * auVar94._4_4_;
  auVar101._0_4_ = auVar83._0_4_ * auVar94._0_4_;
  auVar101._8_4_ = auVar83._8_4_ * auVar94._8_4_;
  auVar101._12_4_ = auVar83._12_4_ * auVar94._12_4_;
  auVar101._16_4_ = auVar94._16_4_ * 0.0;
  auVar101._20_4_ = auVar94._20_4_ * 0.0;
  auVar101._24_4_ = auVar94._24_4_ * 0.0;
  auVar101._28_4_ = auVar94._28_4_;
  auVar94 = vcvtdq2ps_avx(auVar95);
  auVar94 = vsubps_avx(auVar94,ZEXT1632(auVar81));
  auVar103._0_4_ = auVar83._0_4_ * auVar94._0_4_;
  auVar103._4_4_ = auVar83._4_4_ * auVar94._4_4_;
  auVar103._8_4_ = auVar83._8_4_ * auVar94._8_4_;
  auVar103._12_4_ = auVar83._12_4_ * auVar94._12_4_;
  auVar103._16_4_ = auVar94._16_4_ * 0.0;
  auVar103._20_4_ = auVar94._20_4_ * 0.0;
  auVar103._24_4_ = auVar94._24_4_ * 0.0;
  auVar103._28_4_ = 0;
  auVar94 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar73 + uVar69 + 6));
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar94 = vsubps_avx(auVar94,ZEXT1632(auVar84));
  auVar102._4_4_ = auVar94._4_4_ * auVar80._4_4_;
  auVar102._0_4_ = auVar94._0_4_ * auVar80._0_4_;
  auVar102._8_4_ = auVar94._8_4_ * auVar80._8_4_;
  auVar102._12_4_ = auVar94._12_4_ * auVar80._12_4_;
  auVar102._16_4_ = auVar94._16_4_ * 0.0;
  auVar102._20_4_ = auVar94._20_4_ * 0.0;
  auVar102._24_4_ = auVar94._24_4_ * 0.0;
  auVar102._28_4_ = auVar94._28_4_;
  auVar94 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar69 * 0x17 + 6));
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar94 = vsubps_avx(auVar94,ZEXT1632(auVar84));
  auVar91._0_4_ = auVar80._0_4_ * auVar94._0_4_;
  auVar91._4_4_ = auVar80._4_4_ * auVar94._4_4_;
  auVar91._8_4_ = auVar80._8_4_ * auVar94._8_4_;
  auVar91._12_4_ = auVar80._12_4_ * auVar94._12_4_;
  auVar91._16_4_ = auVar94._16_4_ * 0.0;
  auVar91._20_4_ = auVar94._20_4_ * 0.0;
  auVar91._24_4_ = auVar94._24_4_ * 0.0;
  auVar91._28_4_ = 0;
  auVar94 = vpminsd_avx2(auVar100,auVar105);
  auVar95 = vpminsd_avx2(auVar101,auVar103);
  auVar94 = vmaxps_avx(auVar94,auVar95);
  auVar95 = vpminsd_avx2(auVar102,auVar91);
  uVar213 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar97._4_4_ = uVar213;
  auVar97._0_4_ = uVar213;
  auVar97._8_4_ = uVar213;
  auVar97._12_4_ = uVar213;
  auVar97._16_4_ = uVar213;
  auVar97._20_4_ = uVar213;
  auVar97._24_4_ = uVar213;
  auVar97._28_4_ = uVar213;
  auVar95 = vmaxps_avx512vl(auVar95,auVar97);
  auVar94 = vmaxps_avx(auVar94,auVar95);
  auVar95._8_4_ = 0x3f7ffffa;
  auVar95._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar95._12_4_ = 0x3f7ffffa;
  auVar95._16_4_ = 0x3f7ffffa;
  auVar95._20_4_ = 0x3f7ffffa;
  auVar95._24_4_ = 0x3f7ffffa;
  auVar95._28_4_ = 0x3f7ffffa;
  local_280 = vmulps_avx512vl(auVar94,auVar95);
  auVar94 = vpmaxsd_avx2(auVar100,auVar105);
  auVar95 = vpmaxsd_avx2(auVar101,auVar103);
  auVar94 = vminps_avx(auVar94,auVar95);
  auVar95 = vpmaxsd_avx2(auVar102,auVar91);
  fVar222 = ray->tfar;
  auVar96._4_4_ = fVar222;
  auVar96._0_4_ = fVar222;
  auVar96._8_4_ = fVar222;
  auVar96._12_4_ = fVar222;
  auVar96._16_4_ = fVar222;
  auVar96._20_4_ = fVar222;
  auVar96._24_4_ = fVar222;
  auVar96._28_4_ = fVar222;
  auVar95 = vminps_avx512vl(auVar95,auVar96);
  auVar94 = vminps_avx(auVar94,auVar95);
  auVar98._8_4_ = 0x3f800003;
  auVar98._0_8_ = 0x3f8000033f800003;
  auVar98._12_4_ = 0x3f800003;
  auVar98._16_4_ = 0x3f800003;
  auVar98._20_4_ = 0x3f800003;
  auVar98._24_4_ = 0x3f800003;
  auVar98._28_4_ = 0x3f800003;
  auVar94 = vmulps_avx512vl(auVar94,auVar98);
  auVar95 = vpbroadcastd_avx512vl();
  uVar16 = vpcmpgtd_avx512vl(auVar95,_DAT_0205a920);
  uVar15 = vcmpps_avx512vl(local_280,auVar94,2);
  bVar76 = (byte)((byte)uVar15 & (byte)uVar16) == 0;
  bVar77 = !bVar76;
  if (bVar76) {
    return bVar77;
  }
  local_5b0 = (ulong)(byte)((byte)uVar15 & (byte)uVar16);
  local_5b8 = prim;
LAB_01da7148:
  lVar75 = 0;
  for (uVar78 = local_5b0; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x8000000000000000) {
    lVar75 = lVar75 + 1;
  }
  local_8c8 = (ulong)*(uint *)(prim + 2);
  local_8d0 = (ulong)*(uint *)(prim + lVar75 * 4 + 6);
  pGVar6 = (context->scene->geometries).items[local_8c8].ptr;
  uVar78 = (ulong)*(uint *)(*(long *)&pGVar6->field_0x58 +
                           pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * local_8d0);
  p_Var7 = pGVar6[1].intersectionFilterN;
  lVar75 = *(long *)&pGVar6[1].time_range.upper;
  auVar82 = *(undefined1 (*) [16])(lVar75 + (long)p_Var7 * uVar78);
  auVar83 = *(undefined1 (*) [16])(lVar75 + (uVar78 + 1) * (long)p_Var7);
  local_5b0 = local_5b0 - 1 & local_5b0;
  if (local_5b0 != 0) {
    uVar73 = local_5b0 - 1 & local_5b0;
    for (uVar69 = local_5b0; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x8000000000000000) {
    }
    if (uVar73 != 0) {
      for (; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar214._0_4_ = auVar82._0_4_ + auVar83._0_4_;
  auVar214._4_4_ = auVar82._4_4_ + auVar83._4_4_;
  auVar214._8_4_ = auVar82._8_4_ + auVar83._8_4_;
  auVar214._12_4_ = auVar82._12_4_ + auVar83._12_4_;
  aVar1 = (ray->org).field_0;
  aVar2 = (ray->dir).field_0.field_1;
  auVar87._8_4_ = 0x3f000000;
  auVar87._0_8_ = 0x3f0000003f000000;
  auVar87._12_4_ = 0x3f000000;
  auVar80 = vmulps_avx512vl(auVar214,auVar87);
  auVar80 = vsubps_avx(auVar80,(undefined1  [16])aVar1);
  auVar80 = vdpps_avx(auVar80,(undefined1  [16])aVar2,0x7f);
  auVar3 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
  auVar225._4_12_ = ZEXT812(0) << 0x20;
  auVar225._0_4_ = auVar3._0_4_;
  auVar81 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar225);
  auVar226 = ZEXT1664(auVar81);
  auVar3 = vfnmadd213ss_fma(auVar81,auVar3,ZEXT416(0x40000000));
  auVar228 = ZEXT1664(auVar3);
  fVar222 = auVar80._0_4_ * auVar81._0_4_ * auVar3._0_4_;
  local_4b0 = ZEXT416((uint)fVar222);
  auVar215._4_4_ = fVar222;
  auVar215._0_4_ = fVar222;
  auVar215._8_4_ = fVar222;
  auVar215._12_4_ = fVar222;
  fStack_590 = fVar222;
  _local_5a0 = auVar215;
  fStack_58c = fVar222;
  fStack_588 = fVar222;
  fStack_584 = fVar222;
  auVar80 = vfmadd231ps_fma((undefined1  [16])aVar1,(undefined1  [16])aVar2,auVar215);
  auVar80 = vblendps_avx(auVar80,ZEXT816(0) << 0x40,8);
  auVar82 = vsubps_avx(auVar82,auVar80);
  auVar3 = vsubps_avx(*(undefined1 (*) [16])(lVar75 + (uVar78 + 2) * (long)p_Var7),auVar80);
  local_780 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->dir).field_0.m128[0]));
  auVar250 = ZEXT3264(local_780);
  local_7a0 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->dir).field_0.m128[1]));
  auVar254 = ZEXT3264(local_7a0);
  local_340 = *(undefined4 *)((long)&(ray->dir).field_0 + 8);
  uStack_33c = local_340;
  uStack_338 = local_340;
  uStack_334 = local_340;
  uStack_330 = local_340;
  uStack_32c = local_340;
  uStack_328 = local_340;
  uStack_324 = local_340;
  auVar83 = vsubps_avx(auVar83,auVar80);
  auVar80 = vsubps_avx(*(undefined1 (*) [16])(lVar75 + (uVar78 + 3) * (long)p_Var7),auVar80);
  local_1a0 = auVar82._0_4_;
  uStack_19c = local_1a0;
  uStack_198 = local_1a0;
  uStack_194 = local_1a0;
  uStack_190 = local_1a0;
  uStack_18c = local_1a0;
  uStack_188 = local_1a0;
  uStack_184 = local_1a0;
  auVar110._8_4_ = 1;
  auVar110._0_8_ = 0x100000001;
  auVar110._12_4_ = 1;
  auVar110._16_4_ = 1;
  auVar110._20_4_ = 1;
  auVar110._24_4_ = 1;
  auVar110._28_4_ = 1;
  local_520 = ZEXT1632(auVar82);
  local_7c0 = vpermps_avx512vl(auVar110,local_520);
  auVar243 = ZEXT3264(local_7c0);
  auVar113._8_4_ = 2;
  auVar113._0_8_ = 0x200000002;
  auVar113._12_4_ = 2;
  auVar113._16_4_ = 2;
  auVar113._20_4_ = 2;
  auVar113._24_4_ = 2;
  auVar113._28_4_ = 2;
  local_620 = vpermps_avx512vl(auVar113,local_520);
  auVar244 = ZEXT3264(local_620);
  auVar114._8_4_ = 3;
  auVar114._0_8_ = 0x300000003;
  auVar114._12_4_ = 3;
  auVar114._16_4_ = 3;
  auVar114._20_4_ = 3;
  auVar114._24_4_ = 3;
  auVar114._28_4_ = 3;
  local_640 = vpermps_avx512vl(auVar114,local_520);
  auVar245 = ZEXT3264(local_640);
  local_7e0 = vbroadcastss_avx512vl(auVar83);
  auVar246 = ZEXT3264(local_7e0);
  local_560 = ZEXT1632(auVar83);
  local_660 = vpermps_avx512vl(auVar110,local_560);
  auVar247 = ZEXT3264(local_660);
  local_680 = vpermps_avx512vl(auVar113,local_560);
  auVar248 = ZEXT3264(local_680);
  local_800 = vpermps_avx512vl(auVar114,local_560);
  auVar249 = ZEXT3264(local_800);
  local_6a0 = vbroadcastss_avx512vl(auVar3);
  auVar251 = ZEXT3264(local_6a0);
  local_540 = ZEXT1632(auVar3);
  local_6c0 = vpermps_avx512vl(auVar110,local_540);
  auVar253 = ZEXT3264(local_6c0);
  local_6e0 = vpermps_avx512vl(auVar113,local_540);
  auVar255 = ZEXT3264(local_6e0);
  local_220 = vpermps_avx512vl(auVar114,local_540);
  uVar213 = auVar80._0_4_;
  local_240._4_4_ = uVar213;
  local_240._0_4_ = uVar213;
  local_240._8_4_ = uVar213;
  local_240._12_4_ = uVar213;
  local_240._16_4_ = uVar213;
  local_240._20_4_ = uVar213;
  local_240._24_4_ = uVar213;
  local_240._28_4_ = uVar213;
  _local_580 = ZEXT1632(auVar80);
  local_260 = vpermps_avx512vl(auVar110,_local_580);
  _local_1c0 = vpermps_avx2(auVar113,_local_580);
  _local_1e0 = vpermps_avx2(auVar114,_local_580);
  auVar94 = vpermps_avx2(auVar113,ZEXT1632(CONCAT412(aVar2.field_3.w * aVar2.field_3.w,
                                                     CONCAT48(aVar2.z * aVar2.z,
                                                              CONCAT44(aVar2.y * aVar2.y,
                                                                       aVar2.x * aVar2.x)))));
  auVar94 = vfmadd231ps_avx512vl(auVar94,local_7a0,local_7a0);
  local_360 = vfmadd231ps_avx512vl(auVar94,local_780,local_780);
  vandps_avx512vl(local_360,auVar252._0_32_);
  local_818 = 1;
  local_5a8 = 0;
  bVar70 = 0;
  local_4d0 = ZEXT816(0x3f80000000000000);
  auVar203 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 &
                                                  DAT_3f8000003f800000)))))));
  local_200 = local_360;
  do {
    auVar82 = vmovshdup_avx(local_4d0);
    fVar217 = local_4d0._0_4_;
    fVar172 = auVar82._0_4_ - fVar217;
    fVar222 = fVar172 * 0.04761905;
    local_8a0._4_4_ = fVar217;
    local_8a0._0_4_ = fVar217;
    local_8a0._8_4_ = fVar217;
    local_8a0._12_4_ = fVar217;
    local_8a0._16_4_ = fVar217;
    local_8a0._20_4_ = fVar217;
    local_8a0._24_4_ = fVar217;
    local_8a0._28_4_ = fVar217;
    local_8c0._4_4_ = fVar172;
    local_8c0._0_4_ = fVar172;
    local_8c0._8_4_ = fVar172;
    local_8c0._12_4_ = fVar172;
    local_8c0._16_4_ = fVar172;
    local_8c0._20_4_ = fVar172;
    local_8c0._24_4_ = fVar172;
    local_8c0._28_4_ = fVar172;
    auVar82 = vfmadd231ps_fma(local_8a0,local_8c0,_DAT_02020f20);
    auVar94 = vsubps_avx(auVar203._0_32_,ZEXT1632(auVar82));
    fVar217 = auVar82._0_4_;
    fVar218 = auVar82._4_4_;
    fVar219 = auVar82._8_4_;
    fVar220 = auVar82._12_4_;
    fVar221 = auVar94._0_4_;
    fVar154 = auVar94._4_4_;
    fVar191 = auVar94._8_4_;
    fVar230 = auVar94._12_4_;
    fVar232 = auVar94._16_4_;
    fVar234 = auVar94._20_4_;
    fVar235 = auVar94._24_4_;
    auVar37._4_4_ = fVar154 * fVar154 * -fVar218;
    auVar37._0_4_ = fVar221 * fVar221 * -fVar217;
    auVar37._8_4_ = fVar191 * fVar191 * -fVar219;
    auVar37._12_4_ = fVar230 * fVar230 * -fVar220;
    auVar37._16_4_ = fVar232 * fVar232 * -0.0;
    auVar37._20_4_ = fVar234 * fVar234 * -0.0;
    auVar37._24_4_ = fVar235 * fVar235 * -0.0;
    auVar37._28_4_ = 0x80000000;
    auVar203._28_36_ = auVar226._28_36_;
    auVar203._0_28_ =
         ZEXT1628(CONCAT412(fVar220 * fVar220,
                            CONCAT48(fVar219 * fVar219,CONCAT44(fVar218 * fVar218,fVar217 * fVar217)
                                    )));
    fVar227 = fVar217 * 3.0;
    fVar229 = fVar218 * 3.0;
    fVar231 = fVar219 * 3.0;
    fVar233 = fVar220 * 3.0;
    auVar226._28_36_ = auVar228._28_36_;
    auVar226._0_28_ = ZEXT1628(CONCAT412(fVar233,CONCAT48(fVar231,CONCAT44(fVar229,fVar227))));
    fVar236 = auVar228._28_4_ + -5.0;
    auVar169._0_4_ = fVar217 * fVar217 * (fVar227 + -5.0) + 2.0;
    auVar169._4_4_ = fVar218 * fVar218 * (fVar229 + -5.0) + 2.0;
    auVar169._8_4_ = fVar219 * fVar219 * (fVar231 + -5.0) + 2.0;
    auVar169._12_4_ = fVar220 * fVar220 * (fVar233 + -5.0) + 2.0;
    auVar169._16_4_ = 0x40000000;
    auVar169._20_4_ = 0x40000000;
    auVar169._24_4_ = 0x40000000;
    auVar169._28_4_ = 0x40000000;
    auVar228._0_4_ = fVar221 * fVar221;
    auVar228._4_4_ = fVar154 * fVar154;
    auVar228._8_4_ = fVar191 * fVar191;
    auVar228._12_4_ = fVar230 * fVar230;
    auVar228._16_4_ = fVar232 * fVar232;
    auVar228._20_4_ = fVar234 * fVar234;
    auVar228._28_36_ = auVar238._28_36_;
    auVar228._24_4_ = fVar235 * fVar235;
    auVar186._0_4_ = auVar228._0_4_ * (fVar221 * 3.0 + -5.0) + 2.0;
    auVar186._4_4_ = auVar228._4_4_ * (fVar154 * 3.0 + -5.0) + 2.0;
    auVar186._8_4_ = auVar228._8_4_ * (fVar191 * 3.0 + -5.0) + 2.0;
    auVar186._12_4_ = auVar228._12_4_ * (fVar230 * 3.0 + -5.0) + 2.0;
    auVar186._16_4_ = auVar228._16_4_ * (fVar232 * 3.0 + -5.0) + 2.0;
    auVar186._20_4_ = auVar228._20_4_ * (fVar234 * 3.0 + -5.0) + 2.0;
    auVar186._24_4_ = auVar228._24_4_ * (fVar235 * 3.0 + -5.0) + 2.0;
    auVar186._28_4_ = auVar241._28_4_ + -5.0 + 2.0;
    fVar172 = auVar94._28_4_;
    auVar38._4_4_ = fVar218 * fVar218 * -fVar154;
    auVar38._0_4_ = fVar217 * fVar217 * -fVar221;
    auVar38._8_4_ = fVar219 * fVar219 * -fVar191;
    auVar38._12_4_ = fVar220 * fVar220 * -fVar230;
    auVar38._16_4_ = -fVar232 * 0.0 * 0.0;
    auVar38._20_4_ = -fVar234 * 0.0 * 0.0;
    auVar38._24_4_ = -fVar235 * 0.0 * 0.0;
    auVar38._28_4_ = -fVar172;
    auVar96 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar94 = vmulps_avx512vl(auVar37,auVar96);
    auVar95 = vmulps_avx512vl(auVar169,auVar96);
    auVar97 = vmulps_avx512vl(auVar186,auVar96);
    auVar98 = vmulps_avx512vl(auVar38,auVar96);
    auVar99 = vmulps_avx512vl(local_240,auVar98);
    auVar100 = vmulps_avx512vl(local_260,auVar98);
    auVar39._4_4_ = (float)local_1c0._4_4_ * auVar98._4_4_;
    auVar39._0_4_ = (float)local_1c0._0_4_ * auVar98._0_4_;
    auVar39._8_4_ = fStack_1b8 * auVar98._8_4_;
    auVar39._12_4_ = fStack_1b4 * auVar98._12_4_;
    auVar39._16_4_ = fStack_1b0 * auVar98._16_4_;
    auVar39._20_4_ = fStack_1ac * auVar98._20_4_;
    auVar39._24_4_ = fStack_1a8 * auVar98._24_4_;
    auVar39._28_4_ = 0x40000000;
    auVar40._4_4_ = (float)local_1e0._4_4_ * auVar98._4_4_;
    auVar40._0_4_ = (float)local_1e0._0_4_ * auVar98._0_4_;
    auVar40._8_4_ = fStack_1d8 * auVar98._8_4_;
    auVar40._12_4_ = fStack_1d4 * auVar98._12_4_;
    auVar40._16_4_ = fStack_1d0 * auVar98._16_4_;
    auVar40._20_4_ = fStack_1cc * auVar98._20_4_;
    auVar40._24_4_ = fStack_1c8 * auVar98._24_4_;
    auVar40._28_4_ = auVar98._28_4_;
    auVar98 = vfmadd231ps_avx512vl(auVar99,auVar97,auVar251._0_32_);
    auVar99 = vfmadd231ps_avx512vl(auVar100,auVar97,auVar253._0_32_);
    auVar100 = vfmadd231ps_avx512vl(auVar39,auVar97,auVar255._0_32_);
    auVar97 = vfmadd231ps_avx512vl(auVar40,local_220,auVar97);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar95,auVar246._0_32_);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar95,auVar247._0_32_);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar95,auVar248._0_32_);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar249._0_32_,auVar95);
    auVar67._4_4_ = uStack_19c;
    auVar67._0_4_ = local_1a0;
    auVar67._8_4_ = uStack_198;
    auVar67._12_4_ = uStack_194;
    auVar67._16_4_ = uStack_190;
    auVar67._20_4_ = uStack_18c;
    auVar67._24_4_ = uStack_188;
    auVar67._28_4_ = uStack_184;
    local_420 = vfmadd231ps_avx512vl(auVar98,auVar94,auVar67);
    local_700 = vfmadd231ps_avx512vl(auVar99,auVar94,auVar243._0_32_);
    local_900 = vfmadd231ps_avx512vl(auVar100,auVar94,auVar244._0_32_);
    auVar98 = vfmadd231ps_avx512vl(auVar97,auVar245._0_32_,auVar94);
    auVar41._4_4_ = (fVar154 + fVar154) * fVar218;
    auVar41._0_4_ = (fVar221 + fVar221) * fVar217;
    auVar41._8_4_ = (fVar191 + fVar191) * fVar219;
    auVar41._12_4_ = (fVar230 + fVar230) * fVar220;
    auVar41._16_4_ = (fVar232 + fVar232) * 0.0;
    auVar41._20_4_ = (fVar234 + fVar234) * 0.0;
    auVar41._24_4_ = (fVar235 + fVar235) * 0.0;
    auVar41._28_4_ = auVar95._28_4_;
    auVar94 = vsubps_avx(auVar41,auVar228._0_32_);
    auVar208._0_28_ =
         ZEXT1628(CONCAT412((fVar220 + fVar220) * (fVar233 + -5.0) + fVar233 * fVar220,
                            CONCAT48((fVar219 + fVar219) * (fVar231 + -5.0) + fVar231 * fVar219,
                                     CONCAT44((fVar218 + fVar218) * (fVar229 + -5.0) +
                                              fVar229 * fVar218,
                                              (fVar217 + fVar217) * (fVar227 + -5.0) +
                                              fVar227 * fVar217))));
    auVar208._28_4_ = fVar236 + 0.0;
    auVar115._8_4_ = 0x40000000;
    auVar115._0_8_ = 0x4000000040000000;
    auVar115._12_4_ = 0x40000000;
    auVar115._16_4_ = 0x40000000;
    auVar115._20_4_ = 0x40000000;
    auVar115._24_4_ = 0x40000000;
    auVar115._28_4_ = 0x40000000;
    auVar95 = vaddps_avx512vl(auVar226._0_32_,auVar115);
    auVar42._4_4_ = (fVar154 + fVar154) * auVar95._4_4_;
    auVar42._0_4_ = (fVar221 + fVar221) * auVar95._0_4_;
    auVar42._8_4_ = (fVar191 + fVar191) * auVar95._8_4_;
    auVar42._12_4_ = (fVar230 + fVar230) * auVar95._12_4_;
    auVar42._16_4_ = (fVar232 + fVar232) * auVar95._16_4_;
    auVar42._20_4_ = (fVar234 + fVar234) * auVar95._20_4_;
    auVar42._24_4_ = (fVar235 + fVar235) * auVar95._24_4_;
    auVar42._28_4_ = auVar95._28_4_;
    auVar43._4_4_ = fVar154 * 3.0 * fVar154;
    auVar43._0_4_ = fVar221 * 3.0 * fVar221;
    auVar43._8_4_ = fVar191 * 3.0 * fVar191;
    auVar43._12_4_ = fVar230 * 3.0 * fVar230;
    auVar43._16_4_ = fVar232 * 3.0 * fVar232;
    auVar43._20_4_ = fVar234 * 3.0 * fVar234;
    auVar43._24_4_ = fVar235 * 3.0 * fVar235;
    auVar43._28_4_ = fVar172;
    auVar95 = vsubps_avx(auVar42,auVar43);
    auVar97 = vsubps_avx(auVar203._0_32_,auVar41);
    auVar94 = vmulps_avx512vl(auVar94,auVar96);
    auVar99 = vmulps_avx512vl(auVar208,auVar96);
    auVar95 = vmulps_avx512vl(auVar95,auVar96);
    auVar97 = vmulps_avx512vl(auVar97,auVar96);
    fVar217 = auVar97._0_4_;
    fVar218 = auVar97._4_4_;
    auVar44._4_4_ = fVar218 * local_240._4_4_;
    auVar44._0_4_ = fVar217 * local_240._0_4_;
    fVar219 = auVar97._8_4_;
    auVar44._8_4_ = fVar219 * local_240._8_4_;
    fVar220 = auVar97._12_4_;
    auVar44._12_4_ = fVar220 * local_240._12_4_;
    fVar221 = auVar97._16_4_;
    auVar44._16_4_ = fVar221 * local_240._16_4_;
    fVar154 = auVar97._20_4_;
    auVar44._20_4_ = fVar154 * local_240._20_4_;
    fVar191 = auVar97._24_4_;
    auVar44._24_4_ = fVar191 * local_240._24_4_;
    auVar44._28_4_ = fVar236;
    auVar119._8_4_ = 0x3f800000;
    auVar119._0_8_ = &DAT_3f8000003f800000;
    auVar119._12_4_ = 0x3f800000;
    auVar119._16_4_ = 0x3f800000;
    auVar119._20_4_ = 0x3f800000;
    auVar119._24_4_ = 0x3f800000;
    auVar119._28_4_ = 0x3f800000;
    auVar96 = vmulps_avx512vl(local_260,auVar97);
    auVar45._4_4_ = fVar218 * (float)local_1c0._4_4_;
    auVar45._0_4_ = fVar217 * (float)local_1c0._0_4_;
    auVar45._8_4_ = fVar219 * fStack_1b8;
    auVar45._12_4_ = fVar220 * fStack_1b4;
    auVar45._16_4_ = fVar221 * fStack_1b0;
    auVar45._20_4_ = fVar154 * fStack_1ac;
    auVar45._24_4_ = fVar191 * fStack_1a8;
    auVar45._28_4_ = fVar172 + fVar172;
    auVar46._4_4_ = fVar218 * (float)local_1e0._4_4_;
    auVar46._0_4_ = fVar217 * (float)local_1e0._0_4_;
    auVar46._8_4_ = fVar219 * fStack_1d8;
    auVar46._12_4_ = fVar220 * fStack_1d4;
    auVar46._16_4_ = fVar221 * fStack_1d0;
    auVar46._20_4_ = fVar154 * fStack_1cc;
    auVar46._24_4_ = fVar191 * fStack_1c8;
    auVar46._28_4_ = auVar97._28_4_;
    auVar97 = vfmadd231ps_avx512vl(auVar44,auVar95,auVar251._0_32_);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar95,auVar253._0_32_);
    auVar100 = vfmadd231ps_avx512vl(auVar45,auVar95,auVar255._0_32_);
    auVar82 = vfmadd231ps_fma(auVar46,local_220,auVar95);
    auVar95 = vfmadd231ps_avx512vl(auVar97,auVar99,auVar246._0_32_);
    auVar97 = vfmadd231ps_avx512vl(auVar96,auVar99,auVar247._0_32_);
    auVar96 = vfmadd231ps_avx512vl(auVar100,auVar99,auVar248._0_32_);
    auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar82),auVar249._0_32_,auVar99);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar94,auVar67);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar94,auVar243._0_32_);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar94,auVar244._0_32_);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar245._0_32_,auVar94);
    auVar121._4_4_ = (uint)(auVar95._4_4_ * fVar222);
    auVar121._0_4_ = (uint)(auVar95._0_4_ * fVar222);
    auVar121._8_4_ = (uint)(auVar95._8_4_ * fVar222);
    auVar121._12_4_ = (uint)(auVar95._12_4_ * fVar222);
    auVar121._16_4_ = (uint)(auVar95._16_4_ * fVar222);
    auVar121._20_4_ = (uint)(auVar95._20_4_ * fVar222);
    auVar121._24_4_ = (uint)(auVar95._24_4_ * fVar222);
    auVar121._28_4_ = auVar94._28_4_;
    auVar47._4_4_ = auVar97._4_4_ * fVar222;
    auVar47._0_4_ = auVar97._0_4_ * fVar222;
    auVar47._8_4_ = auVar97._8_4_ * fVar222;
    auVar47._12_4_ = auVar97._12_4_ * fVar222;
    auVar47._16_4_ = auVar97._16_4_ * fVar222;
    auVar47._20_4_ = auVar97._20_4_ * fVar222;
    auVar47._24_4_ = auVar97._24_4_ * fVar222;
    auVar47._28_4_ = auVar97._28_4_;
    auVar241 = ZEXT3264(auVar47);
    auVar48._4_4_ = auVar96._4_4_ * fVar222;
    auVar48._0_4_ = auVar96._0_4_ * fVar222;
    auVar48._8_4_ = auVar96._8_4_ * fVar222;
    auVar48._12_4_ = auVar96._12_4_ * fVar222;
    auVar48._16_4_ = auVar96._16_4_ * fVar222;
    auVar48._20_4_ = auVar96._20_4_ * fVar222;
    auVar48._24_4_ = auVar96._24_4_ * fVar222;
    auVar48._28_4_ = auVar96._28_4_;
    fVar172 = auVar99._0_4_ * fVar222;
    fVar217 = auVar99._4_4_ * fVar222;
    auVar49._4_4_ = fVar217;
    auVar49._0_4_ = fVar172;
    fVar218 = auVar99._8_4_ * fVar222;
    auVar49._8_4_ = fVar218;
    fVar219 = auVar99._12_4_ * fVar222;
    auVar49._12_4_ = fVar219;
    fVar220 = auVar99._16_4_ * fVar222;
    auVar49._16_4_ = fVar220;
    fVar221 = auVar99._20_4_ * fVar222;
    auVar49._20_4_ = fVar221;
    fVar222 = auVar99._24_4_ * fVar222;
    auVar49._24_4_ = fVar222;
    auVar49._28_4_ = fStack_1c4;
    auVar82 = vxorps_avx512vl(auVar255._0_16_,auVar255._0_16_);
    auVar96 = vpermt2ps_avx512vl(local_420,_DAT_0205fd20,ZEXT1632(auVar82));
    auVar226 = ZEXT3264(auVar96);
    local_880 = vpermt2ps_avx512vl(local_700,_DAT_0205fd20,ZEXT1632(auVar82));
    auVar97 = ZEXT1632(auVar82);
    auVar99 = vpermt2ps_avx512vl(local_900,_DAT_0205fd20,auVar97);
    auVar209._0_4_ = auVar98._0_4_ + fVar172;
    auVar209._4_4_ = auVar98._4_4_ + fVar217;
    auVar209._8_4_ = auVar98._8_4_ + fVar218;
    auVar209._12_4_ = auVar98._12_4_ + fVar219;
    auVar209._16_4_ = auVar98._16_4_ + fVar220;
    auVar209._20_4_ = auVar98._20_4_ + fVar221;
    auVar209._24_4_ = auVar98._24_4_ + fVar222;
    auVar209._28_4_ = auVar98._28_4_ + fStack_1c4;
    auVar94 = vmaxps_avx(auVar98,auVar209);
    auVar95 = vminps_avx(auVar98,auVar209);
    auVar98 = vpermt2ps_avx512vl(auVar98,_DAT_0205fd20,auVar97);
    auVar100 = vpermt2ps_avx512vl(auVar121,_DAT_0205fd20,auVar97);
    auVar101 = vpermt2ps_avx512vl(auVar47,_DAT_0205fd20,auVar97);
    auVar109 = ZEXT1632(auVar82);
    auVar102 = vpermt2ps_avx512vl(auVar48,_DAT_0205fd20,auVar109);
    auVar97 = vpermt2ps_avx512vl(auVar49,_DAT_0205fd20,auVar109);
    auVar92 = vsubps_avx512vl(auVar98,auVar97);
    auVar93 = vsubps_avx512vl(auVar96,local_420);
    auVar97 = vsubps_avx(local_880,local_700);
    local_720 = vsubps_avx512vl(auVar99,local_900);
    auVar88 = vmulps_avx512vl(auVar97,auVar48);
    auVar88 = vfmsub231ps_avx512vl(auVar88,auVar47,local_720);
    auVar89 = vmulps_avx512vl(local_720,auVar121);
    auVar89 = vfmsub231ps_avx512vl(auVar89,auVar48,auVar93);
    auVar90 = vmulps_avx512vl(auVar93,auVar47);
    auVar90 = vfmsub231ps_avx512vl(auVar90,auVar121,auVar97);
    auVar90 = vmulps_avx512vl(auVar90,auVar90);
    auVar89 = vfmadd231ps_avx512vl(auVar90,auVar89,auVar89);
    auVar88 = vfmadd231ps_avx512vl(auVar89,auVar88,auVar88);
    auVar89 = vmulps_avx512vl(local_720,local_720);
    auVar89 = vfmadd231ps_avx512vl(auVar89,auVar97,auVar97);
    auVar89 = vfmadd231ps_avx512vl(auVar89,auVar93,auVar93);
    auVar90 = vrcp14ps_avx512vl(auVar89);
    auVar91 = vfnmadd213ps_avx512vl(auVar90,auVar89,auVar119);
    auVar90 = vfmadd132ps_avx512vl(auVar91,auVar90,auVar90);
    auVar88 = vmulps_avx512vl(auVar88,auVar90);
    auVar91 = vmulps_avx512vl(auVar97,auVar102);
    auVar91 = vfmsub231ps_avx512vl(auVar91,auVar101,local_720);
    auVar103 = vmulps_avx512vl(local_720,auVar100);
    auVar103 = vfmsub231ps_avx512vl(auVar103,auVar102,auVar93);
    auVar104 = vmulps_avx512vl(auVar93,auVar101);
    auVar104 = vfmsub231ps_avx512vl(auVar104,auVar100,auVar97);
    auVar104 = vmulps_avx512vl(auVar104,auVar104);
    auVar103 = vfmadd231ps_avx512vl(auVar104,auVar103,auVar103);
    auVar91 = vfmadd231ps_avx512vl(auVar103,auVar91,auVar91);
    auVar90 = vmulps_avx512vl(auVar91,auVar90);
    auVar88 = vmaxps_avx512vl(auVar88,auVar90);
    auVar88 = vsqrtps_avx512vl(auVar88);
    auVar90 = vmaxps_avx512vl(auVar92,auVar98);
    auVar94 = vmaxps_avx512vl(auVar94,auVar90);
    auVar90 = vaddps_avx512vl(auVar88,auVar94);
    auVar94 = vminps_avx512vl(auVar92,auVar98);
    auVar94 = vminps_avx(auVar95,auVar94);
    auVar94 = vsubps_avx512vl(auVar94,auVar88);
    auVar116._8_4_ = 0x3f800002;
    auVar116._0_8_ = 0x3f8000023f800002;
    auVar116._12_4_ = 0x3f800002;
    auVar116._16_4_ = 0x3f800002;
    auVar116._20_4_ = 0x3f800002;
    auVar116._24_4_ = 0x3f800002;
    auVar116._28_4_ = 0x3f800002;
    auVar95 = vmulps_avx512vl(auVar90,auVar116);
    auVar23._8_4_ = 0x3f7ffffc;
    auVar23._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar23._12_4_ = 0x3f7ffffc;
    auVar23._16_4_ = 0x3f7ffffc;
    auVar23._20_4_ = 0x3f7ffffc;
    auVar23._24_4_ = 0x3f7ffffc;
    auVar23._28_4_ = 0x3f7ffffc;
    local_500 = vmulps_avx512vl(auVar94,auVar23);
    auVar50._4_4_ = auVar95._4_4_ * auVar95._4_4_;
    auVar50._0_4_ = auVar95._0_4_ * auVar95._0_4_;
    auVar50._8_4_ = auVar95._8_4_ * auVar95._8_4_;
    auVar50._12_4_ = auVar95._12_4_ * auVar95._12_4_;
    auVar50._16_4_ = auVar95._16_4_ * auVar95._16_4_;
    auVar50._20_4_ = auVar95._20_4_ * auVar95._20_4_;
    auVar50._24_4_ = auVar95._24_4_ * auVar95._24_4_;
    auVar50._28_4_ = local_500._28_4_;
    auVar94 = vrsqrt14ps_avx512vl(auVar89);
    auVar24._8_4_ = 0xbf000000;
    auVar24._0_8_ = 0xbf000000bf000000;
    auVar24._12_4_ = 0xbf000000;
    auVar24._16_4_ = 0xbf000000;
    auVar24._20_4_ = 0xbf000000;
    auVar24._24_4_ = 0xbf000000;
    auVar24._28_4_ = 0xbf000000;
    auVar95 = vmulps_avx512vl(auVar89,auVar24);
    auVar51._4_4_ = auVar94._4_4_ * auVar95._4_4_;
    auVar51._0_4_ = auVar94._0_4_ * auVar95._0_4_;
    auVar51._8_4_ = auVar94._8_4_ * auVar95._8_4_;
    auVar51._12_4_ = auVar94._12_4_ * auVar95._12_4_;
    auVar51._16_4_ = auVar94._16_4_ * auVar95._16_4_;
    auVar51._20_4_ = auVar94._20_4_ * auVar95._20_4_;
    auVar51._24_4_ = auVar94._24_4_ * auVar95._24_4_;
    auVar51._28_4_ = auVar95._28_4_;
    auVar95 = vmulps_avx512vl(auVar94,auVar94);
    auVar95 = vmulps_avx512vl(auVar95,auVar51);
    auVar25._8_4_ = 0x3fc00000;
    auVar25._0_8_ = 0x3fc000003fc00000;
    auVar25._12_4_ = 0x3fc00000;
    auVar25._16_4_ = 0x3fc00000;
    auVar25._20_4_ = 0x3fc00000;
    auVar25._24_4_ = 0x3fc00000;
    auVar25._28_4_ = 0x3fc00000;
    auVar98 = vfmadd231ps_avx512vl(auVar95,auVar94,auVar25);
    auVar52._4_4_ = auVar98._4_4_ * auVar93._4_4_;
    auVar52._0_4_ = auVar98._0_4_ * auVar93._0_4_;
    auVar52._8_4_ = auVar98._8_4_ * auVar93._8_4_;
    auVar52._12_4_ = auVar98._12_4_ * auVar93._12_4_;
    auVar52._16_4_ = auVar98._16_4_ * auVar93._16_4_;
    auVar52._20_4_ = auVar98._20_4_ * auVar93._20_4_;
    auVar52._24_4_ = auVar98._24_4_ * auVar93._24_4_;
    auVar52._28_4_ = auVar94._28_4_;
    auVar94 = vmulps_avx512vl(auVar97,auVar98);
    auVar95 = vmulps_avx512vl(local_720,auVar98);
    auVar92 = vsubps_avx512vl(auVar109,local_420);
    auVar88 = vsubps_avx512vl(auVar109,local_700);
    auVar89 = vsubps_avx512vl(auVar109,local_900);
    auVar65._4_4_ = uStack_33c;
    auVar65._0_4_ = local_340;
    auVar65._8_4_ = uStack_338;
    auVar65._12_4_ = uStack_334;
    auVar65._16_4_ = uStack_330;
    auVar65._20_4_ = uStack_32c;
    auVar65._24_4_ = uStack_328;
    auVar65._28_4_ = uStack_324;
    auVar90 = vmulps_avx512vl(auVar65,auVar89);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar254._0_32_,auVar88);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar250._0_32_,auVar92);
    auVar91 = vmulps_avx512vl(auVar89,auVar89);
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar88,auVar88);
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar92,auVar92);
    auVar103 = vmulps_avx512vl(auVar65,auVar95);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar94,auVar254._0_32_);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar52,auVar250._0_32_);
    auVar95 = vmulps_avx512vl(auVar89,auVar95);
    auVar94 = vfmadd231ps_avx512vl(auVar95,auVar88,auVar94);
    auVar104 = vfmadd231ps_avx512vl(auVar94,auVar92,auVar52);
    auVar105 = vmulps_avx512vl(auVar103,auVar103);
    auVar94 = vsubps_avx(local_200,auVar105);
    auVar95 = vmulps_avx512vl(auVar103,auVar104);
    auVar95 = vsubps_avx512vl(auVar90,auVar95);
    auVar90 = vaddps_avx512vl(auVar95,auVar95);
    auVar95 = vmulps_avx512vl(auVar104,auVar104);
    auVar91 = vsubps_avx512vl(auVar91,auVar95);
    auVar95 = vsubps_avx(auVar91,auVar50);
    auVar106 = vmulps_avx512vl(auVar90,auVar90);
    auVar26._8_4_ = 0x40800000;
    auVar26._0_8_ = 0x4080000040800000;
    auVar26._12_4_ = 0x40800000;
    auVar26._16_4_ = 0x40800000;
    auVar26._20_4_ = 0x40800000;
    auVar26._24_4_ = 0x40800000;
    auVar26._28_4_ = 0x40800000;
    auVar107 = vmulps_avx512vl(auVar94,auVar26);
    auVar108 = vmulps_avx512vl(auVar107,auVar95);
    auVar108 = vsubps_avx512vl(auVar106,auVar108);
    uVar78 = vcmpps_avx512vl(auVar108,auVar109,5);
    bVar72 = (byte)uVar78;
    if (bVar72 == 0) {
      auVar111 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar112 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar199 = auVar119;
    }
    else {
      auVar108 = vsqrtps_avx512vl(auVar108);
      auVar109 = vaddps_avx512vl(auVar94,auVar94);
      auVar110 = vrcp14ps_avx512vl(auVar109);
      auVar109 = vfnmadd213ps_avx512vl(auVar109,auVar110,auVar119);
      auVar109 = vfmadd132ps_avx512vl(auVar109,auVar110,auVar110);
      auVar27._8_4_ = 0x80000000;
      auVar27._0_8_ = 0x8000000080000000;
      auVar27._12_4_ = 0x80000000;
      auVar27._16_4_ = 0x80000000;
      auVar27._20_4_ = 0x80000000;
      auVar27._24_4_ = 0x80000000;
      auVar27._28_4_ = 0x80000000;
      auVar110 = vxorps_avx512vl(auVar90,auVar27);
      auVar110 = vsubps_avx512vl(auVar110,auVar108);
      auVar110 = vmulps_avx512vl(auVar110,auVar109);
      auVar108 = vsubps_avx512vl(auVar108,auVar90);
      auVar108 = vmulps_avx512vl(auVar108,auVar109);
      auVar109 = vfmadd213ps_avx512vl(auVar103,auVar110,auVar104);
      local_3a0 = vmulps_avx512vl(auVar98,auVar109);
      auVar109 = vfmadd213ps_avx512vl(auVar103,auVar108,auVar104);
      local_3c0 = vmulps_avx512vl(auVar98,auVar109);
      auVar109 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar109 = vblendmps_avx512vl(auVar109,auVar110);
      auVar111._0_4_ =
           (uint)(bVar72 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar72 & 1) * local_3c0._0_4_;
      bVar76 = (bool)((byte)(uVar78 >> 1) & 1);
      auVar111._4_4_ = (uint)bVar76 * auVar109._4_4_ | (uint)!bVar76 * local_3c0._4_4_;
      bVar76 = (bool)((byte)(uVar78 >> 2) & 1);
      auVar111._8_4_ = (uint)bVar76 * auVar109._8_4_ | (uint)!bVar76 * local_3c0._8_4_;
      bVar76 = (bool)((byte)(uVar78 >> 3) & 1);
      auVar111._12_4_ = (uint)bVar76 * auVar109._12_4_ | (uint)!bVar76 * local_3c0._12_4_;
      bVar76 = (bool)((byte)(uVar78 >> 4) & 1);
      auVar111._16_4_ = (uint)bVar76 * auVar109._16_4_ | (uint)!bVar76 * local_3c0._16_4_;
      bVar76 = (bool)((byte)(uVar78 >> 5) & 1);
      auVar111._20_4_ = (uint)bVar76 * auVar109._20_4_ | (uint)!bVar76 * local_3c0._20_4_;
      bVar76 = (bool)((byte)(uVar78 >> 6) & 1);
      auVar111._24_4_ = (uint)bVar76 * auVar109._24_4_ | (uint)!bVar76 * local_3c0._24_4_;
      bVar76 = SUB81(uVar78 >> 7,0);
      auVar111._28_4_ = (uint)bVar76 * auVar109._28_4_ | (uint)!bVar76 * local_3c0._28_4_;
      auVar198._8_4_ = 0xff800000;
      auVar198._0_8_ = 0xff800000ff800000;
      auVar198._12_4_ = 0xff800000;
      auVar198._16_4_ = 0xff800000;
      auVar198._20_4_ = 0xff800000;
      auVar198._24_4_ = 0xff800000;
      auVar198._28_4_ = 0xff800000;
      auVar109 = vblendmps_avx512vl(auVar198,auVar108);
      auVar112._0_4_ =
           (uint)(bVar72 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar108._0_4_;
      bVar76 = (bool)((byte)(uVar78 >> 1) & 1);
      auVar112._4_4_ = (uint)bVar76 * auVar109._4_4_ | (uint)!bVar76 * auVar108._4_4_;
      bVar76 = (bool)((byte)(uVar78 >> 2) & 1);
      auVar112._8_4_ = (uint)bVar76 * auVar109._8_4_ | (uint)!bVar76 * auVar108._8_4_;
      bVar76 = (bool)((byte)(uVar78 >> 3) & 1);
      auVar112._12_4_ = (uint)bVar76 * auVar109._12_4_ | (uint)!bVar76 * auVar108._12_4_;
      bVar76 = (bool)((byte)(uVar78 >> 4) & 1);
      auVar112._16_4_ = (uint)bVar76 * auVar109._16_4_ | (uint)!bVar76 * auVar108._16_4_;
      bVar76 = (bool)((byte)(uVar78 >> 5) & 1);
      auVar112._20_4_ = (uint)bVar76 * auVar109._20_4_ | (uint)!bVar76 * auVar108._20_4_;
      bVar76 = (bool)((byte)(uVar78 >> 6) & 1);
      auVar112._24_4_ = (uint)bVar76 * auVar109._24_4_ | (uint)!bVar76 * auVar108._24_4_;
      bVar76 = SUB81(uVar78 >> 7,0);
      auVar112._28_4_ = (uint)bVar76 * auVar109._28_4_ | (uint)!bVar76 * auVar108._28_4_;
      auVar108 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar105,auVar108);
      auVar109 = vmaxps_avx512vl(local_360,auVar108);
      auVar28._8_4_ = 0x36000000;
      auVar28._0_8_ = 0x3600000036000000;
      auVar28._12_4_ = 0x36000000;
      auVar28._16_4_ = 0x36000000;
      auVar28._20_4_ = 0x36000000;
      auVar28._24_4_ = 0x36000000;
      auVar28._28_4_ = 0x36000000;
      auVar109 = vmulps_avx512vl(auVar109,auVar28);
      vandps_avx512vl(auVar94,auVar108);
      uVar69 = vcmpps_avx512vl(auVar109,auVar109,1);
      uVar78 = uVar78 & uVar69;
      bVar74 = (byte)uVar78;
      if (bVar74 != 0) {
        uVar69 = vcmpps_avx512vl(auVar95,_DAT_02020f00,2);
        auVar212._8_4_ = 0xff800000;
        auVar212._0_8_ = 0xff800000ff800000;
        auVar212._12_4_ = 0xff800000;
        auVar212._16_4_ = 0xff800000;
        auVar212._20_4_ = 0xff800000;
        auVar212._24_4_ = 0xff800000;
        auVar212._28_4_ = 0xff800000;
        auVar95 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar108 = vblendmps_avx512vl(auVar95,auVar212);
        bVar71 = (byte)uVar69;
        uVar79 = (uint)(bVar71 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar109._0_4_;
        bVar76 = (bool)((byte)(uVar69 >> 1) & 1);
        uVar132 = (uint)bVar76 * auVar108._4_4_ | (uint)!bVar76 * auVar109._4_4_;
        bVar76 = (bool)((byte)(uVar69 >> 2) & 1);
        uVar133 = (uint)bVar76 * auVar108._8_4_ | (uint)!bVar76 * auVar109._8_4_;
        bVar76 = (bool)((byte)(uVar69 >> 3) & 1);
        uVar134 = (uint)bVar76 * auVar108._12_4_ | (uint)!bVar76 * auVar109._12_4_;
        bVar76 = (bool)((byte)(uVar69 >> 4) & 1);
        uVar135 = (uint)bVar76 * auVar108._16_4_ | (uint)!bVar76 * auVar109._16_4_;
        bVar76 = (bool)((byte)(uVar69 >> 5) & 1);
        uVar136 = (uint)bVar76 * auVar108._20_4_ | (uint)!bVar76 * auVar109._20_4_;
        bVar76 = (bool)((byte)(uVar69 >> 6) & 1);
        uVar137 = (uint)bVar76 * auVar108._24_4_ | (uint)!bVar76 * auVar109._24_4_;
        bVar76 = SUB81(uVar69 >> 7,0);
        uVar138 = (uint)bVar76 * auVar108._28_4_ | (uint)!bVar76 * auVar109._28_4_;
        auVar111._0_4_ = (bVar74 & 1) * uVar79 | !(bool)(bVar74 & 1) * auVar111._0_4_;
        bVar76 = (bool)((byte)(uVar78 >> 1) & 1);
        auVar111._4_4_ = bVar76 * uVar132 | !bVar76 * auVar111._4_4_;
        bVar76 = (bool)((byte)(uVar78 >> 2) & 1);
        auVar111._8_4_ = bVar76 * uVar133 | !bVar76 * auVar111._8_4_;
        bVar76 = (bool)((byte)(uVar78 >> 3) & 1);
        auVar111._12_4_ = bVar76 * uVar134 | !bVar76 * auVar111._12_4_;
        bVar76 = (bool)((byte)(uVar78 >> 4) & 1);
        auVar111._16_4_ = bVar76 * uVar135 | !bVar76 * auVar111._16_4_;
        bVar76 = (bool)((byte)(uVar78 >> 5) & 1);
        auVar111._20_4_ = bVar76 * uVar136 | !bVar76 * auVar111._20_4_;
        bVar76 = (bool)((byte)(uVar78 >> 6) & 1);
        auVar111._24_4_ = bVar76 * uVar137 | !bVar76 * auVar111._24_4_;
        bVar76 = SUB81(uVar78 >> 7,0);
        auVar111._28_4_ = bVar76 * uVar138 | !bVar76 * auVar111._28_4_;
        auVar95 = vblendmps_avx512vl(auVar212,auVar95);
        bVar76 = (bool)((byte)(uVar69 >> 1) & 1);
        bVar9 = (bool)((byte)(uVar69 >> 2) & 1);
        bVar10 = (bool)((byte)(uVar69 >> 3) & 1);
        bVar11 = (bool)((byte)(uVar69 >> 4) & 1);
        bVar12 = (bool)((byte)(uVar69 >> 5) & 1);
        bVar13 = (bool)((byte)(uVar69 >> 6) & 1);
        bVar14 = SUB81(uVar69 >> 7,0);
        auVar112._0_4_ =
             (uint)(bVar74 & 1) *
             ((uint)(bVar71 & 1) * auVar95._0_4_ | !(bool)(bVar71 & 1) * uVar79) |
             !(bool)(bVar74 & 1) * auVar112._0_4_;
        bVar8 = (bool)((byte)(uVar78 >> 1) & 1);
        auVar112._4_4_ =
             (uint)bVar8 * ((uint)bVar76 * auVar95._4_4_ | !bVar76 * uVar132) |
             !bVar8 * auVar112._4_4_;
        bVar76 = (bool)((byte)(uVar78 >> 2) & 1);
        auVar112._8_4_ =
             (uint)bVar76 * ((uint)bVar9 * auVar95._8_4_ | !bVar9 * uVar133) |
             !bVar76 * auVar112._8_4_;
        bVar76 = (bool)((byte)(uVar78 >> 3) & 1);
        auVar112._12_4_ =
             (uint)bVar76 * ((uint)bVar10 * auVar95._12_4_ | !bVar10 * uVar134) |
             !bVar76 * auVar112._12_4_;
        bVar76 = (bool)((byte)(uVar78 >> 4) & 1);
        auVar112._16_4_ =
             (uint)bVar76 * ((uint)bVar11 * auVar95._16_4_ | !bVar11 * uVar135) |
             !bVar76 * auVar112._16_4_;
        bVar76 = (bool)((byte)(uVar78 >> 5) & 1);
        auVar112._20_4_ =
             (uint)bVar76 * ((uint)bVar12 * auVar95._20_4_ | !bVar12 * uVar136) |
             !bVar76 * auVar112._20_4_;
        bVar76 = (bool)((byte)(uVar78 >> 6) & 1);
        auVar112._24_4_ =
             (uint)bVar76 * ((uint)bVar13 * auVar95._24_4_ | !bVar13 * uVar137) |
             !bVar76 * auVar112._24_4_;
        bVar76 = SUB81(uVar78 >> 7,0);
        auVar112._28_4_ =
             (uint)bVar76 * ((uint)bVar14 * auVar95._28_4_ | !bVar14 * uVar138) |
             !bVar76 * auVar112._28_4_;
        bVar72 = (~bVar74 | bVar71) & bVar72;
      }
      auVar199._8_4_ = 0x3f800000;
      auVar199._0_8_ = &DAT_3f8000003f800000;
      auVar199._12_4_ = 0x3f800000;
      auVar199._16_4_ = 0x3f800000;
      auVar199._20_4_ = 0x3f800000;
      auVar199._24_4_ = 0x3f800000;
      auVar199._28_4_ = 0x3f800000;
    }
    fVar222 = (float)local_5a0._0_4_;
    fVar172 = (float)local_5a0._4_4_;
    fVar217 = fStack_598;
    fVar218 = fStack_594;
    fVar219 = fStack_590;
    fVar220 = fStack_58c;
    fVar221 = fStack_588;
    fVar154 = fStack_584;
    if ((bVar72 & 0x7f) == 0) {
      auVar94 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar252 = ZEXT3264(auVar94);
LAB_01da7e50:
      auVar238 = ZEXT3264(auVar119);
      auVar228 = ZEXT3264(auVar121);
      auVar203 = ZEXT3264(auVar199);
      auVar250 = ZEXT3264(local_780);
      auVar254 = ZEXT3264(local_7a0);
      auVar243 = ZEXT3264(local_7c0);
      auVar244 = ZEXT3264(local_620);
      auVar245 = ZEXT3264(local_640);
      auVar246 = ZEXT3264(local_7e0);
      auVar247 = ZEXT3264(local_660);
      auVar248 = ZEXT3264(local_680);
      auVar249 = ZEXT3264(local_800);
      auVar251 = ZEXT3264(local_6a0);
      auVar253 = ZEXT3264(local_6c0);
      auVar255 = ZEXT3264(local_6e0);
    }
    else {
      auVar82 = vsubss_avx512f(ZEXT416((uint)(ray->org).field_0.m128[3]),local_4b0);
      auVar200._0_4_ = auVar82._0_4_;
      auVar200._4_4_ = auVar200._0_4_;
      auVar200._8_4_ = auVar200._0_4_;
      auVar200._12_4_ = auVar200._0_4_;
      auVar200._16_4_ = auVar200._0_4_;
      auVar200._20_4_ = auVar200._0_4_;
      auVar200._24_4_ = auVar200._0_4_;
      auVar200._28_4_ = auVar200._0_4_;
      auVar95 = vmaxps_avx512vl(auVar200,auVar111);
      auVar82 = vsubss_avx512f(ZEXT416((uint)ray->tfar),local_4b0);
      auVar210._0_4_ = auVar82._0_4_;
      auVar210._4_4_ = auVar210._0_4_;
      auVar210._8_4_ = auVar210._0_4_;
      auVar210._12_4_ = auVar210._0_4_;
      auVar210._16_4_ = auVar210._0_4_;
      auVar210._20_4_ = auVar210._0_4_;
      auVar210._24_4_ = auVar210._0_4_;
      auVar210._28_4_ = auVar210._0_4_;
      auVar108 = vminps_avx512vl(auVar210,auVar112);
      auVar89 = vmulps_avx512vl(auVar89,auVar48);
      auVar88 = vfmadd213ps_avx512vl(auVar88,auVar47,auVar89);
      auVar92 = vfmadd213ps_avx512vl(auVar92,auVar121,auVar88);
      auVar66._4_4_ = uStack_33c;
      auVar66._0_4_ = local_340;
      auVar66._8_4_ = uStack_338;
      auVar66._12_4_ = uStack_334;
      auVar66._16_4_ = uStack_330;
      auVar66._20_4_ = uStack_32c;
      auVar66._24_4_ = uStack_328;
      auVar66._28_4_ = uStack_324;
      auVar88 = vmulps_avx512vl(auVar66,auVar48);
      auVar88 = vfmadd231ps_avx512vl(auVar88,local_7a0,auVar47);
      auVar88 = vfmadd231ps_avx512vl(auVar88,local_780,auVar121);
      auVar89 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar252 = ZEXT3264(auVar89);
      vandps_avx512vl(auVar88,auVar89);
      auVar109 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar15 = vcmpps_avx512vl(auVar89,auVar109,1);
      auVar110 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar92 = vxorps_avx512vl(auVar92,auVar110);
      auVar113 = vrcp14ps_avx512vl(auVar88);
      auVar114 = vxorps_avx512vl(auVar88,auVar110);
      auVar115 = vfnmadd213ps_avx512vl(auVar113,auVar88,auVar199);
      auVar115 = vfmadd132ps_avx512vl(auVar115,auVar113,auVar113);
      auVar92 = vmulps_avx512vl(auVar115,auVar92);
      uVar16 = vcmpps_avx512vl(auVar88,auVar114,1);
      bVar74 = (byte)uVar15 | (byte)uVar16;
      auVar115 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar116 = vblendmps_avx512vl(auVar92,auVar115);
      auVar117._0_4_ =
           (uint)(bVar74 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar74 & 1) * auVar113._0_4_;
      bVar76 = (bool)(bVar74 >> 1 & 1);
      auVar117._4_4_ = (uint)bVar76 * auVar116._4_4_ | (uint)!bVar76 * auVar113._4_4_;
      bVar76 = (bool)(bVar74 >> 2 & 1);
      auVar117._8_4_ = (uint)bVar76 * auVar116._8_4_ | (uint)!bVar76 * auVar113._8_4_;
      bVar76 = (bool)(bVar74 >> 3 & 1);
      auVar117._12_4_ = (uint)bVar76 * auVar116._12_4_ | (uint)!bVar76 * auVar113._12_4_;
      bVar76 = (bool)(bVar74 >> 4 & 1);
      auVar117._16_4_ = (uint)bVar76 * auVar116._16_4_ | (uint)!bVar76 * auVar113._16_4_;
      bVar76 = (bool)(bVar74 >> 5 & 1);
      auVar117._20_4_ = (uint)bVar76 * auVar116._20_4_ | (uint)!bVar76 * auVar113._20_4_;
      bVar76 = (bool)(bVar74 >> 6 & 1);
      auVar117._24_4_ = (uint)bVar76 * auVar116._24_4_ | (uint)!bVar76 * auVar113._24_4_;
      auVar117._28_4_ =
           (uint)(bVar74 >> 7) * auVar116._28_4_ | (uint)!(bool)(bVar74 >> 7) * auVar113._28_4_;
      auVar95 = vmaxps_avx(auVar95,auVar117);
      uVar16 = vcmpps_avx512vl(auVar88,auVar114,6);
      bVar74 = (byte)uVar15 | (byte)uVar16;
      auVar113 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar118._0_4_ =
           (uint)(bVar74 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar74 & 1) * auVar92._0_4_;
      bVar76 = (bool)(bVar74 >> 1 & 1);
      auVar118._4_4_ = (uint)bVar76 * auVar113._4_4_ | (uint)!bVar76 * auVar92._4_4_;
      bVar76 = (bool)(bVar74 >> 2 & 1);
      auVar118._8_4_ = (uint)bVar76 * auVar113._8_4_ | (uint)!bVar76 * auVar92._8_4_;
      bVar76 = (bool)(bVar74 >> 3 & 1);
      auVar118._12_4_ = (uint)bVar76 * auVar113._12_4_ | (uint)!bVar76 * auVar92._12_4_;
      bVar76 = (bool)(bVar74 >> 4 & 1);
      auVar118._16_4_ = (uint)bVar76 * auVar113._16_4_ | (uint)!bVar76 * auVar92._16_4_;
      bVar76 = (bool)(bVar74 >> 5 & 1);
      auVar118._20_4_ = (uint)bVar76 * auVar113._20_4_ | (uint)!bVar76 * auVar92._20_4_;
      bVar76 = (bool)(bVar74 >> 6 & 1);
      auVar118._24_4_ = (uint)bVar76 * auVar113._24_4_ | (uint)!bVar76 * auVar92._24_4_;
      auVar118._28_4_ =
           (uint)(bVar74 >> 7) * auVar113._28_4_ | (uint)!(bool)(bVar74 >> 7) * auVar92._28_4_;
      auVar92 = vminps_avx(auVar108,auVar118);
      auVar96 = vsubps_avx(ZEXT832(0) << 0x20,auVar96);
      auVar88 = vsubps_avx(ZEXT832(0) << 0x20,local_880);
      auVar108 = ZEXT832(0) << 0x20;
      auVar99 = vsubps_avx(auVar108,auVar99);
      auVar53._4_4_ = auVar99._4_4_ * auVar102._4_4_;
      auVar53._0_4_ = auVar99._0_4_ * auVar102._0_4_;
      auVar53._8_4_ = auVar99._8_4_ * auVar102._8_4_;
      auVar53._12_4_ = auVar99._12_4_ * auVar102._12_4_;
      auVar53._16_4_ = auVar99._16_4_ * auVar102._16_4_;
      auVar53._20_4_ = auVar99._20_4_ * auVar102._20_4_;
      auVar53._24_4_ = auVar99._24_4_ * auVar102._24_4_;
      auVar53._28_4_ = auVar99._28_4_;
      auVar99 = vfnmsub231ps_avx512vl(auVar53,auVar101,auVar88);
      auVar96 = vfnmadd231ps_avx512vl(auVar99,auVar100,auVar96);
      auVar99 = vmulps_avx512vl(auVar66,auVar102);
      auVar99 = vfnmsub231ps_avx512vl(auVar99,local_7a0,auVar101);
      auVar99 = vfnmadd231ps_avx512vl(auVar99,local_780,auVar100);
      vandps_avx512vl(auVar99,auVar89);
      uVar15 = vcmpps_avx512vl(auVar99,auVar109,1);
      auVar96 = vxorps_avx512vl(auVar96,auVar110);
      auVar100 = vrcp14ps_avx512vl(auVar99);
      auVar119 = vxorps_avx512vl(auVar99,auVar110);
      auVar102 = vfnmadd213ps_avx512vl(auVar100,auVar99,auVar199);
      auVar82 = vfmadd132ps_fma(auVar102,auVar100,auVar100);
      auVar241 = ZEXT1664(auVar82);
      fVar191 = auVar82._0_4_ * auVar96._0_4_;
      fVar230 = auVar82._4_4_ * auVar96._4_4_;
      auVar54._4_4_ = fVar230;
      auVar54._0_4_ = fVar191;
      fVar232 = auVar82._8_4_ * auVar96._8_4_;
      auVar54._8_4_ = fVar232;
      fVar234 = auVar82._12_4_ * auVar96._12_4_;
      auVar54._12_4_ = fVar234;
      fVar235 = auVar96._16_4_ * 0.0;
      auVar54._16_4_ = fVar235;
      fVar227 = auVar96._20_4_ * 0.0;
      auVar54._20_4_ = fVar227;
      fVar229 = auVar96._24_4_ * 0.0;
      auVar54._24_4_ = fVar229;
      auVar54._28_4_ = auVar96._28_4_;
      uVar16 = vcmpps_avx512vl(auVar99,auVar119,1);
      bVar74 = (byte)uVar15 | (byte)uVar16;
      auVar102 = vblendmps_avx512vl(auVar54,auVar115);
      auVar120._0_4_ =
           (uint)(bVar74 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar74 & 1) * auVar100._0_4_;
      bVar76 = (bool)(bVar74 >> 1 & 1);
      auVar120._4_4_ = (uint)bVar76 * auVar102._4_4_ | (uint)!bVar76 * auVar100._4_4_;
      bVar76 = (bool)(bVar74 >> 2 & 1);
      auVar120._8_4_ = (uint)bVar76 * auVar102._8_4_ | (uint)!bVar76 * auVar100._8_4_;
      bVar76 = (bool)(bVar74 >> 3 & 1);
      auVar120._12_4_ = (uint)bVar76 * auVar102._12_4_ | (uint)!bVar76 * auVar100._12_4_;
      bVar76 = (bool)(bVar74 >> 4 & 1);
      auVar120._16_4_ = (uint)bVar76 * auVar102._16_4_ | (uint)!bVar76 * auVar100._16_4_;
      bVar76 = (bool)(bVar74 >> 5 & 1);
      auVar120._20_4_ = (uint)bVar76 * auVar102._20_4_ | (uint)!bVar76 * auVar100._20_4_;
      bVar76 = (bool)(bVar74 >> 6 & 1);
      auVar120._24_4_ = (uint)bVar76 * auVar102._24_4_ | (uint)!bVar76 * auVar100._24_4_;
      auVar120._28_4_ =
           (uint)(bVar74 >> 7) * auVar102._28_4_ | (uint)!(bool)(bVar74 >> 7) * auVar100._28_4_;
      _local_440 = vmaxps_avx(auVar95,auVar120);
      uVar16 = vcmpps_avx512vl(auVar99,auVar119,6);
      bVar74 = (byte)uVar15 | (byte)uVar16;
      auVar121._0_4_ =
           (uint)(bVar74 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar74 & 1) * (int)fVar191;
      bVar76 = (bool)(bVar74 >> 1 & 1);
      auVar121._4_4_ = (uint)bVar76 * auVar113._4_4_ | (uint)!bVar76 * (int)fVar230;
      bVar76 = (bool)(bVar74 >> 2 & 1);
      auVar121._8_4_ = (uint)bVar76 * auVar113._8_4_ | (uint)!bVar76 * (int)fVar232;
      bVar76 = (bool)(bVar74 >> 3 & 1);
      auVar121._12_4_ = (uint)bVar76 * auVar113._12_4_ | (uint)!bVar76 * (int)fVar234;
      bVar76 = (bool)(bVar74 >> 4 & 1);
      auVar121._16_4_ = (uint)bVar76 * auVar113._16_4_ | (uint)!bVar76 * (int)fVar235;
      bVar76 = (bool)(bVar74 >> 5 & 1);
      auVar121._20_4_ = (uint)bVar76 * auVar113._20_4_ | (uint)!bVar76 * (int)fVar227;
      bVar76 = (bool)(bVar74 >> 6 & 1);
      auVar121._24_4_ = (uint)bVar76 * auVar113._24_4_ | (uint)!bVar76 * (int)fVar229;
      auVar121._28_4_ =
           (uint)(bVar74 >> 7) * auVar113._28_4_ | (uint)!(bool)(bVar74 >> 7) * auVar96._28_4_;
      local_2c0 = vminps_avx(auVar92,auVar121);
      auVar226 = ZEXT3264(local_2c0);
      uVar15 = vcmpps_avx512vl(_local_440,local_2c0,2);
      bVar72 = bVar72 & 0x7f & (byte)uVar15;
      if (bVar72 == 0) goto LAB_01da7e50;
      auVar95 = vmaxps_avx(auVar108,local_500);
      auVar96 = vminps_avx512vl(local_3a0,auVar199);
      auVar60 = ZEXT412(0);
      auVar99 = ZEXT1232(auVar60) << 0x20;
      auVar96 = vmaxps_avx(auVar96,ZEXT1232(auVar60) << 0x20);
      auVar100 = vminps_avx512vl(local_3c0,auVar199);
      auVar241 = ZEXT3264(CONCAT428(0x3e000000,
                                    CONCAT424(0x3e000000,
                                              CONCAT420(0x3e000000,
                                                        CONCAT416(0x3e000000,
                                                                  CONCAT412(0x3e000000,
                                                                            CONCAT48(0x3e000000,
                                                                                                                                                                          
                                                  0x3e0000003e000000)))))));
      auVar55._4_4_ = (auVar96._4_4_ + 1.0) * 0.125;
      auVar55._0_4_ = (auVar96._0_4_ + 0.0) * 0.125;
      auVar55._8_4_ = (auVar96._8_4_ + 2.0) * 0.125;
      auVar55._12_4_ = (auVar96._12_4_ + 3.0) * 0.125;
      auVar55._16_4_ = (auVar96._16_4_ + 4.0) * 0.125;
      auVar55._20_4_ = (auVar96._20_4_ + 5.0) * 0.125;
      auVar55._24_4_ = (auVar96._24_4_ + 6.0) * 0.125;
      auVar55._28_4_ = auVar96._28_4_ + 7.0;
      auVar82 = vfmadd213ps_fma(auVar55,local_8c0,local_8a0);
      local_3a0 = ZEXT1632(auVar82);
      auVar96 = vmaxps_avx(auVar100,ZEXT1232(auVar60) << 0x20);
      auVar56._4_4_ = (auVar96._4_4_ + 1.0) * 0.125;
      auVar56._0_4_ = (auVar96._0_4_ + 0.0) * 0.125;
      auVar56._8_4_ = (auVar96._8_4_ + 2.0) * 0.125;
      auVar56._12_4_ = (auVar96._12_4_ + 3.0) * 0.125;
      auVar56._16_4_ = (auVar96._16_4_ + 4.0) * 0.125;
      auVar56._20_4_ = (auVar96._20_4_ + 5.0) * 0.125;
      auVar56._24_4_ = (auVar96._24_4_ + 6.0) * 0.125;
      auVar56._28_4_ = auVar96._28_4_ + 7.0;
      auVar82 = vfmadd213ps_fma(auVar56,local_8c0,local_8a0);
      local_3c0 = ZEXT1632(auVar82);
      auVar201._0_4_ = auVar95._0_4_ * auVar95._0_4_;
      auVar201._4_4_ = auVar95._4_4_ * auVar95._4_4_;
      auVar201._8_4_ = auVar95._8_4_ * auVar95._8_4_;
      auVar201._12_4_ = auVar95._12_4_ * auVar95._12_4_;
      auVar201._16_4_ = auVar95._16_4_ * auVar95._16_4_;
      auVar201._20_4_ = auVar95._20_4_ * auVar95._20_4_;
      auVar201._24_4_ = auVar95._24_4_ * auVar95._24_4_;
      auVar201._28_4_ = 0;
      auVar95 = vsubps_avx(auVar91,auVar201);
      auVar96 = vmulps_avx512vl(auVar107,auVar95);
      auVar96 = vsubps_avx512vl(auVar106,auVar96);
      uVar15 = vcmpps_avx512vl(auVar96,ZEXT1232(auVar60) << 0x20,5);
      bVar74 = (byte)uVar15;
      auVar247 = ZEXT3264(local_660);
      auVar248 = ZEXT3264(local_680);
      auVar251 = ZEXT3264(local_6a0);
      auVar253 = ZEXT3264(local_6c0);
      auVar255 = ZEXT3264(local_6e0);
      if (bVar74 == 0) {
        auVar97 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar203 = ZEXT864(0) << 0x20;
        auVar96 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar100 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar228 = ZEXT864(0) << 0x20;
        auVar122._8_4_ = 0x7f800000;
        auVar122._0_8_ = 0x7f8000007f800000;
        auVar122._12_4_ = 0x7f800000;
        auVar122._16_4_ = 0x7f800000;
        auVar122._20_4_ = 0x7f800000;
        auVar122._24_4_ = 0x7f800000;
        auVar122._28_4_ = 0x7f800000;
        auVar123._8_4_ = 0xff800000;
        auVar123._0_8_ = 0xff800000ff800000;
        auVar123._12_4_ = 0xff800000;
        auVar123._16_4_ = 0xff800000;
        auVar123._20_4_ = 0xff800000;
        auVar123._24_4_ = 0xff800000;
        auVar123._28_4_ = 0xff800000;
      }
      else {
        auVar83 = vxorps_avx512vl(auVar101._0_16_,auVar101._0_16_);
        uVar78 = vcmpps_avx512vl(auVar96,auVar108,5);
        auVar96 = vsqrtps_avx(auVar96);
        auVar211._0_4_ = auVar94._0_4_ + auVar94._0_4_;
        auVar211._4_4_ = auVar94._4_4_ + auVar94._4_4_;
        auVar211._8_4_ = auVar94._8_4_ + auVar94._8_4_;
        auVar211._12_4_ = auVar94._12_4_ + auVar94._12_4_;
        auVar211._16_4_ = auVar94._16_4_ + auVar94._16_4_;
        auVar211._20_4_ = auVar94._20_4_ + auVar94._20_4_;
        auVar211._24_4_ = auVar94._24_4_ + auVar94._24_4_;
        auVar211._28_4_ = auVar94._28_4_ + auVar94._28_4_;
        auVar99 = vrcp14ps_avx512vl(auVar211);
        auVar100 = vfnmadd213ps_avx512vl(auVar211,auVar99,auVar199);
        auVar82 = vfmadd132ps_fma(auVar100,auVar99,auVar99);
        auVar29._8_4_ = 0x80000000;
        auVar29._0_8_ = 0x8000000080000000;
        auVar29._12_4_ = 0x80000000;
        auVar29._16_4_ = 0x80000000;
        auVar29._20_4_ = 0x80000000;
        auVar29._24_4_ = 0x80000000;
        auVar29._28_4_ = 0x80000000;
        auVar99 = vxorps_avx512vl(auVar90,auVar29);
        auVar99 = vsubps_avx(auVar99,auVar96);
        auVar57._4_4_ = auVar99._4_4_ * auVar82._4_4_;
        auVar57._0_4_ = auVar99._0_4_ * auVar82._0_4_;
        auVar57._8_4_ = auVar99._8_4_ * auVar82._8_4_;
        auVar57._12_4_ = auVar99._12_4_ * auVar82._12_4_;
        auVar57._16_4_ = auVar99._16_4_ * 0.0;
        auVar57._20_4_ = auVar99._20_4_ * 0.0;
        auVar57._24_4_ = auVar99._24_4_ * 0.0;
        auVar57._28_4_ = 0x3e000000;
        auVar241 = ZEXT3264(auVar57);
        auVar96 = vsubps_avx512vl(auVar96,auVar90);
        auVar242._0_4_ = auVar96._0_4_ * auVar82._0_4_;
        auVar242._4_4_ = auVar96._4_4_ * auVar82._4_4_;
        auVar242._8_4_ = auVar96._8_4_ * auVar82._8_4_;
        auVar242._12_4_ = auVar96._12_4_ * auVar82._12_4_;
        auVar242._16_4_ = auVar96._16_4_ * 0.0;
        auVar242._20_4_ = auVar96._20_4_ * 0.0;
        auVar242._24_4_ = auVar96._24_4_ * 0.0;
        auVar242._28_4_ = 0;
        auVar96 = vfmadd213ps_avx512vl(auVar103,auVar57,auVar104);
        auVar58._4_4_ = auVar98._4_4_ * auVar96._4_4_;
        auVar58._0_4_ = auVar98._0_4_ * auVar96._0_4_;
        auVar58._8_4_ = auVar98._8_4_ * auVar96._8_4_;
        auVar58._12_4_ = auVar98._12_4_ * auVar96._12_4_;
        auVar58._16_4_ = auVar98._16_4_ * auVar96._16_4_;
        auVar58._20_4_ = auVar98._20_4_ * auVar96._20_4_;
        auVar58._24_4_ = auVar98._24_4_ * auVar96._24_4_;
        auVar58._28_4_ = auVar99._28_4_;
        auVar96 = vmulps_avx512vl(local_780,auVar57);
        auVar99 = vmulps_avx512vl(local_7a0,auVar57);
        auVar101 = vmulps_avx512vl(auVar66,auVar57);
        auVar100 = vfmadd213ps_avx512vl(auVar93,auVar58,local_420);
        auVar96 = vsubps_avx512vl(auVar96,auVar100);
        auVar100 = vfmadd213ps_avx512vl(auVar97,auVar58,local_700);
        auVar100 = vsubps_avx512vl(auVar99,auVar100);
        auVar82 = vfmadd213ps_fma(auVar58,local_720,local_900);
        auVar99 = vsubps_avx(auVar101,ZEXT1632(auVar82));
        auVar228 = ZEXT3264(auVar99);
        auVar99 = vfmadd213ps_avx512vl(auVar103,auVar242,auVar104);
        auVar98 = vmulps_avx512vl(auVar98,auVar99);
        auVar99 = vmulps_avx512vl(local_780,auVar242);
        auVar101 = vmulps_avx512vl(local_7a0,auVar242);
        auVar102 = vmulps_avx512vl(auVar66,auVar242);
        auVar82 = vfmadd213ps_fma(auVar93,auVar98,local_420);
        auVar99 = vsubps_avx(auVar99,ZEXT1632(auVar82));
        auVar82 = vfmadd213ps_fma(auVar97,auVar98,local_700);
        auVar97 = vsubps_avx512vl(auVar101,ZEXT1632(auVar82));
        auVar82 = vfmadd213ps_fma(local_720,auVar98,local_900);
        auVar98 = vsubps_avx512vl(auVar102,ZEXT1632(auVar82));
        auVar203 = ZEXT3264(auVar98);
        auVar145._8_4_ = 0x7f800000;
        auVar145._0_8_ = 0x7f8000007f800000;
        auVar145._12_4_ = 0x7f800000;
        auVar145._16_4_ = 0x7f800000;
        auVar145._20_4_ = 0x7f800000;
        auVar145._24_4_ = 0x7f800000;
        auVar145._28_4_ = 0x7f800000;
        auVar98 = vblendmps_avx512vl(auVar145,auVar57);
        bVar76 = (bool)((byte)uVar78 & 1);
        auVar122._0_4_ = (uint)bVar76 * auVar98._0_4_ | (uint)!bVar76 * local_420._0_4_;
        bVar76 = (bool)((byte)(uVar78 >> 1) & 1);
        auVar122._4_4_ = (uint)bVar76 * auVar98._4_4_ | (uint)!bVar76 * local_420._4_4_;
        bVar76 = (bool)((byte)(uVar78 >> 2) & 1);
        auVar122._8_4_ = (uint)bVar76 * auVar98._8_4_ | (uint)!bVar76 * local_420._8_4_;
        bVar76 = (bool)((byte)(uVar78 >> 3) & 1);
        auVar122._12_4_ = (uint)bVar76 * auVar98._12_4_ | (uint)!bVar76 * local_420._12_4_;
        bVar76 = (bool)((byte)(uVar78 >> 4) & 1);
        auVar122._16_4_ = (uint)bVar76 * auVar98._16_4_ | (uint)!bVar76 * local_420._16_4_;
        bVar76 = (bool)((byte)(uVar78 >> 5) & 1);
        auVar122._20_4_ = (uint)bVar76 * auVar98._20_4_ | (uint)!bVar76 * local_420._20_4_;
        bVar76 = (bool)((byte)(uVar78 >> 6) & 1);
        auVar122._24_4_ = (uint)bVar76 * auVar98._24_4_ | (uint)!bVar76 * local_420._24_4_;
        bVar76 = SUB81(uVar78 >> 7,0);
        auVar122._28_4_ = (uint)bVar76 * auVar98._28_4_ | (uint)!bVar76 * local_420._28_4_;
        auVar146._8_4_ = 0xff800000;
        auVar146._0_8_ = 0xff800000ff800000;
        auVar146._12_4_ = 0xff800000;
        auVar146._16_4_ = 0xff800000;
        auVar146._20_4_ = 0xff800000;
        auVar146._24_4_ = 0xff800000;
        auVar146._28_4_ = 0xff800000;
        auVar98 = vblendmps_avx512vl(auVar146,auVar242);
        bVar76 = (bool)((byte)uVar78 & 1);
        auVar123._0_4_ = (uint)bVar76 * auVar98._0_4_ | (uint)!bVar76 * -0x800000;
        bVar76 = (bool)((byte)(uVar78 >> 1) & 1);
        auVar123._4_4_ = (uint)bVar76 * auVar98._4_4_ | (uint)!bVar76 * -0x800000;
        bVar76 = (bool)((byte)(uVar78 >> 2) & 1);
        auVar123._8_4_ = (uint)bVar76 * auVar98._8_4_ | (uint)!bVar76 * -0x800000;
        bVar76 = (bool)((byte)(uVar78 >> 3) & 1);
        auVar123._12_4_ = (uint)bVar76 * auVar98._12_4_ | (uint)!bVar76 * -0x800000;
        bVar76 = (bool)((byte)(uVar78 >> 4) & 1);
        auVar123._16_4_ = (uint)bVar76 * auVar98._16_4_ | (uint)!bVar76 * -0x800000;
        bVar76 = (bool)((byte)(uVar78 >> 5) & 1);
        auVar123._20_4_ = (uint)bVar76 * auVar98._20_4_ | (uint)!bVar76 * -0x800000;
        bVar76 = (bool)((byte)(uVar78 >> 6) & 1);
        auVar123._24_4_ = (uint)bVar76 * auVar98._24_4_ | (uint)!bVar76 * -0x800000;
        bVar76 = SUB81(uVar78 >> 7,0);
        auVar123._28_4_ = (uint)bVar76 * auVar98._28_4_ | (uint)!bVar76 * -0x800000;
        vandps_avx512vl(auVar105,auVar89);
        auVar98 = vmaxps_avx(local_360,auVar123);
        auVar30._8_4_ = 0x36000000;
        auVar30._0_8_ = 0x3600000036000000;
        auVar30._12_4_ = 0x36000000;
        auVar30._16_4_ = 0x36000000;
        auVar30._20_4_ = 0x36000000;
        auVar30._24_4_ = 0x36000000;
        auVar30._28_4_ = 0x36000000;
        auVar98 = vmulps_avx512vl(auVar98,auVar30);
        vandps_avx512vl(auVar94,auVar89);
        uVar69 = vcmpps_avx512vl(auVar98,auVar98,1);
        uVar78 = uVar78 & uVar69;
        bVar71 = (byte)uVar78;
        if (bVar71 != 0) {
          uVar69 = vcmpps_avx512vl(auVar95,ZEXT1632(auVar83),2);
          auVar223._8_4_ = 0xff800000;
          auVar223._0_8_ = 0xff800000ff800000;
          auVar223._12_4_ = 0xff800000;
          auVar223._16_4_ = 0xff800000;
          auVar223._20_4_ = 0xff800000;
          auVar223._24_4_ = 0xff800000;
          auVar223._28_4_ = 0xff800000;
          auVar237._8_4_ = 0x7f800000;
          auVar237._0_8_ = 0x7f8000007f800000;
          auVar237._12_4_ = 0x7f800000;
          auVar237._16_4_ = 0x7f800000;
          auVar237._20_4_ = 0x7f800000;
          auVar237._24_4_ = 0x7f800000;
          auVar237._28_4_ = 0x7f800000;
          auVar94 = vblendmps_avx512vl(auVar237,auVar223);
          bVar68 = (byte)uVar69;
          uVar79 = (uint)(bVar68 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar98._0_4_;
          bVar76 = (bool)((byte)(uVar69 >> 1) & 1);
          uVar132 = (uint)bVar76 * auVar94._4_4_ | (uint)!bVar76 * auVar98._4_4_;
          bVar76 = (bool)((byte)(uVar69 >> 2) & 1);
          uVar133 = (uint)bVar76 * auVar94._8_4_ | (uint)!bVar76 * auVar98._8_4_;
          bVar76 = (bool)((byte)(uVar69 >> 3) & 1);
          uVar134 = (uint)bVar76 * auVar94._12_4_ | (uint)!bVar76 * auVar98._12_4_;
          bVar76 = (bool)((byte)(uVar69 >> 4) & 1);
          uVar135 = (uint)bVar76 * auVar94._16_4_ | (uint)!bVar76 * auVar98._16_4_;
          bVar76 = (bool)((byte)(uVar69 >> 5) & 1);
          uVar136 = (uint)bVar76 * auVar94._20_4_ | (uint)!bVar76 * auVar98._20_4_;
          bVar76 = (bool)((byte)(uVar69 >> 6) & 1);
          uVar137 = (uint)bVar76 * auVar94._24_4_ | (uint)!bVar76 * auVar98._24_4_;
          bVar76 = SUB81(uVar69 >> 7,0);
          uVar138 = (uint)bVar76 * auVar94._28_4_ | (uint)!bVar76 * auVar98._28_4_;
          auVar122._0_4_ = (bVar71 & 1) * uVar79 | !(bool)(bVar71 & 1) * auVar122._0_4_;
          bVar76 = (bool)((byte)(uVar78 >> 1) & 1);
          auVar122._4_4_ = bVar76 * uVar132 | !bVar76 * auVar122._4_4_;
          bVar76 = (bool)((byte)(uVar78 >> 2) & 1);
          auVar122._8_4_ = bVar76 * uVar133 | !bVar76 * auVar122._8_4_;
          bVar76 = (bool)((byte)(uVar78 >> 3) & 1);
          auVar122._12_4_ = bVar76 * uVar134 | !bVar76 * auVar122._12_4_;
          bVar76 = (bool)((byte)(uVar78 >> 4) & 1);
          auVar122._16_4_ = bVar76 * uVar135 | !bVar76 * auVar122._16_4_;
          bVar76 = (bool)((byte)(uVar78 >> 5) & 1);
          auVar122._20_4_ = bVar76 * uVar136 | !bVar76 * auVar122._20_4_;
          bVar76 = (bool)((byte)(uVar78 >> 6) & 1);
          auVar122._24_4_ = bVar76 * uVar137 | !bVar76 * auVar122._24_4_;
          bVar76 = SUB81(uVar78 >> 7,0);
          auVar122._28_4_ = bVar76 * uVar138 | !bVar76 * auVar122._28_4_;
          auVar94 = vblendmps_avx512vl(auVar223,auVar237);
          bVar76 = (bool)((byte)(uVar69 >> 1) & 1);
          bVar9 = (bool)((byte)(uVar69 >> 2) & 1);
          bVar10 = (bool)((byte)(uVar69 >> 3) & 1);
          bVar11 = (bool)((byte)(uVar69 >> 4) & 1);
          bVar12 = (bool)((byte)(uVar69 >> 5) & 1);
          bVar13 = (bool)((byte)(uVar69 >> 6) & 1);
          bVar14 = SUB81(uVar69 >> 7,0);
          auVar123._0_4_ =
               (uint)(bVar71 & 1) *
               ((uint)(bVar68 & 1) * auVar94._0_4_ | !(bool)(bVar68 & 1) * uVar79) |
               !(bool)(bVar71 & 1) * auVar123._0_4_;
          bVar8 = (bool)((byte)(uVar78 >> 1) & 1);
          auVar123._4_4_ =
               (uint)bVar8 * ((uint)bVar76 * auVar94._4_4_ | !bVar76 * uVar132) |
               !bVar8 * auVar123._4_4_;
          bVar76 = (bool)((byte)(uVar78 >> 2) & 1);
          auVar123._8_4_ =
               (uint)bVar76 * ((uint)bVar9 * auVar94._8_4_ | !bVar9 * uVar133) |
               !bVar76 * auVar123._8_4_;
          bVar76 = (bool)((byte)(uVar78 >> 3) & 1);
          auVar123._12_4_ =
               (uint)bVar76 * ((uint)bVar10 * auVar94._12_4_ | !bVar10 * uVar134) |
               !bVar76 * auVar123._12_4_;
          bVar76 = (bool)((byte)(uVar78 >> 4) & 1);
          auVar123._16_4_ =
               (uint)bVar76 * ((uint)bVar11 * auVar94._16_4_ | !bVar11 * uVar135) |
               !bVar76 * auVar123._16_4_;
          bVar76 = (bool)((byte)(uVar78 >> 5) & 1);
          auVar123._20_4_ =
               (uint)bVar76 * ((uint)bVar12 * auVar94._20_4_ | !bVar12 * uVar136) |
               !bVar76 * auVar123._20_4_;
          bVar76 = (bool)((byte)(uVar78 >> 6) & 1);
          auVar123._24_4_ =
               (uint)bVar76 * ((uint)bVar13 * auVar94._24_4_ | !bVar13 * uVar137) |
               !bVar76 * auVar123._24_4_;
          bVar76 = SUB81(uVar78 >> 7,0);
          auVar123._28_4_ =
               (uint)bVar76 * ((uint)bVar14 * auVar94._28_4_ | !bVar14 * uVar138) |
               !bVar76 * auVar123._28_4_;
          bVar74 = (~bVar71 | bVar68) & bVar74;
        }
      }
      auVar254 = ZEXT3264(local_7a0);
      auVar250 = ZEXT3264(local_780);
      auVar243 = ZEXT3264(local_7c0);
      auVar246 = ZEXT3264(local_7e0);
      auVar249 = ZEXT3264(local_800);
      uVar213 = *(undefined4 *)&(ray->dir).field_0;
      auVar216._4_4_ = uVar213;
      auVar216._0_4_ = uVar213;
      auVar216._8_4_ = uVar213;
      auVar216._12_4_ = uVar213;
      auVar216._16_4_ = uVar213;
      auVar216._20_4_ = uVar213;
      auVar216._24_4_ = uVar213;
      auVar216._28_4_ = uVar213;
      uVar213 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
      auVar224._4_4_ = uVar213;
      auVar224._0_4_ = uVar213;
      auVar224._8_4_ = uVar213;
      auVar224._12_4_ = uVar213;
      auVar224._16_4_ = uVar213;
      auVar224._20_4_ = uVar213;
      auVar224._24_4_ = uVar213;
      auVar224._28_4_ = uVar213;
      fVar191 = (ray->dir).field_0.m128[2];
      auVar238 = ZEXT3264(CONCAT428(fVar191,CONCAT424(fVar191,CONCAT420(fVar191,CONCAT416(fVar191,
                                                  CONCAT412(fVar191,CONCAT48(fVar191,CONCAT44(
                                                  fVar191,fVar191))))))));
      auVar244._0_4_ = fVar191 * auVar203._0_4_;
      auVar244._4_4_ = fVar191 * auVar203._4_4_;
      auVar244._8_4_ = fVar191 * auVar203._8_4_;
      auVar244._12_4_ = fVar191 * auVar203._12_4_;
      auVar244._16_4_ = fVar191 * auVar203._16_4_;
      auVar244._20_4_ = fVar191 * auVar203._20_4_;
      auVar244._28_36_ = auVar203._28_36_;
      auVar244._24_4_ = fVar191 * auVar203._24_4_;
      auVar82 = vfmadd231ps_fma(auVar244._0_32_,auVar224,auVar97);
      auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar216,auVar99);
      _local_320 = _local_440;
      local_300 = vminps_avx(local_2c0,auVar122);
      vandps_avx512vl(ZEXT1632(auVar82),auVar89);
      _local_400 = vmaxps_avx(_local_440,auVar123);
      _local_2e0 = _local_400;
      auVar147._8_4_ = 0x3e99999a;
      auVar147._0_8_ = 0x3e99999a3e99999a;
      auVar147._12_4_ = 0x3e99999a;
      auVar147._16_4_ = 0x3e99999a;
      auVar147._20_4_ = 0x3e99999a;
      auVar147._24_4_ = 0x3e99999a;
      auVar147._28_4_ = 0x3e99999a;
      uVar15 = vcmpps_avx512vl(local_800,auVar147,1);
      local_804 = (undefined4)uVar15;
      uVar15 = vcmpps_avx512vl(_local_440,local_300,2);
      bVar71 = (byte)uVar15 & bVar72;
      uVar16 = vcmpps_avx512vl(_local_400,local_2c0,2);
      auVar244 = ZEXT3264(local_620);
      auVar245 = ZEXT3264(local_640);
      if ((bVar72 & ((byte)uVar16 | (byte)uVar15)) == 0) {
        auVar203 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                       &
                                                  DAT_3f8000003f800000)))))));
      }
      else {
        auVar59._4_4_ = auVar228._4_4_ * fVar191;
        auVar59._0_4_ = auVar228._0_4_ * fVar191;
        auVar59._8_4_ = auVar228._8_4_ * fVar191;
        auVar59._12_4_ = auVar228._12_4_ * fVar191;
        auVar59._16_4_ = auVar228._16_4_ * fVar191;
        auVar59._20_4_ = auVar228._20_4_ * fVar191;
        auVar59._24_4_ = auVar228._24_4_ * fVar191;
        auVar59._28_4_ = 0x3e99999a;
        auVar82 = vfmadd213ps_fma(auVar100,auVar224,auVar59);
        auVar82 = vfmadd213ps_fma(auVar96,auVar216,ZEXT1632(auVar82));
        vandps_avx512vl(ZEXT1632(auVar82),auVar89);
        uVar15 = vcmpps_avx512vl(local_640,auVar147,1);
        local_80c = (uint)(byte)~bVar74;
        bVar74 = (byte)uVar15 | ~bVar74;
        auVar148._8_4_ = 2;
        auVar148._0_8_ = 0x200000002;
        auVar148._12_4_ = 2;
        auVar148._16_4_ = 2;
        auVar148._20_4_ = 2;
        auVar148._24_4_ = 2;
        auVar148._28_4_ = 2;
        auVar31._8_4_ = 3;
        auVar31._0_8_ = 0x300000003;
        auVar31._12_4_ = 3;
        auVar31._16_4_ = 3;
        auVar31._20_4_ = 3;
        auVar31._24_4_ = 3;
        auVar31._28_4_ = 3;
        auVar94 = vpblendmd_avx512vl(auVar148,auVar31);
        local_2a0._0_4_ = (uint)(bVar74 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar74 & 1) * 2;
        bVar76 = (bool)(bVar74 >> 1 & 1);
        local_2a0._4_4_ = (uint)bVar76 * auVar94._4_4_ | (uint)!bVar76 * 2;
        bVar76 = (bool)(bVar74 >> 2 & 1);
        local_2a0._8_4_ = (uint)bVar76 * auVar94._8_4_ | (uint)!bVar76 * 2;
        bVar76 = (bool)(bVar74 >> 3 & 1);
        local_2a0._12_4_ = (uint)bVar76 * auVar94._12_4_ | (uint)!bVar76 * 2;
        bVar76 = (bool)(bVar74 >> 4 & 1);
        local_2a0._16_4_ = (uint)bVar76 * auVar94._16_4_ | (uint)!bVar76 * 2;
        bVar76 = (bool)(bVar74 >> 5 & 1);
        local_2a0._20_4_ = (uint)bVar76 * auVar94._20_4_ | (uint)!bVar76 * 2;
        bVar76 = (bool)(bVar74 >> 6 & 1);
        local_2a0._24_4_ = (uint)bVar76 * auVar94._24_4_ | (uint)!bVar76 * 2;
        local_2a0._28_4_ = (uint)(bVar74 >> 7) * auVar94._28_4_ | (uint)!(bool)(bVar74 >> 7) * 2;
        local_380 = vpbroadcastd_avx512vl();
        uVar15 = vpcmpd_avx512vl(local_380,local_2a0,5);
        local_808 = (uint)bVar71;
        bVar71 = (byte)uVar15 & bVar71;
        if (bVar71 == 0) {
          auVar205._8_4_ = 0x7fffffff;
          auVar205._0_8_ = 0x7fffffff7fffffff;
          auVar205._12_4_ = 0x7fffffff;
        }
        else {
          auVar83 = vminps_avx(local_520._0_16_,local_560._0_16_);
          auVar82 = vmaxps_avx(local_520._0_16_,local_560._0_16_);
          auVar80 = vminps_avx(local_540._0_16_,local_580._0_16_);
          auVar3 = vminps_avx(auVar83,auVar80);
          auVar83 = vmaxps_avx(local_540._0_16_,local_580._0_16_);
          auVar80 = vmaxps_avx(auVar82,auVar83);
          auVar173._8_4_ = 0x7fffffff;
          auVar173._0_8_ = 0x7fffffff7fffffff;
          auVar173._12_4_ = 0x7fffffff;
          auVar82 = vandps_avx(auVar3,auVar173);
          auVar83 = vandps_avx(auVar80,auVar173);
          auVar82 = vmaxps_avx(auVar82,auVar83);
          auVar83 = vmovshdup_avx(auVar82);
          auVar83 = vmaxss_avx(auVar83,auVar82);
          auVar82 = vshufpd_avx(auVar82,auVar82,1);
          auVar82 = vmaxss_avx(auVar82,auVar83);
          fVar222 = auVar82._0_4_ * 1.9073486e-06;
          local_4c0 = vshufps_avx(auVar80,auVar80,0xff);
          local_3e0 = (float)local_440._0_4_ + (float)local_5a0._0_4_;
          fStack_3dc = (float)local_440._4_4_ + (float)local_5a0._4_4_;
          fStack_3d8 = fStack_438 + fStack_598;
          fStack_3d4 = fStack_434 + fStack_594;
          fStack_3d0 = fStack_430 + fStack_590;
          fStack_3cc = fStack_42c + fStack_58c;
          fStack_3c8 = fStack_428 + fStack_588;
          fStack_3c4 = fStack_424 + fStack_584;
          do {
            auVar97 = local_880;
            auVar149._8_4_ = 0x7f800000;
            auVar149._0_8_ = 0x7f8000007f800000;
            auVar149._12_4_ = 0x7f800000;
            auVar149._16_4_ = 0x7f800000;
            auVar149._20_4_ = 0x7f800000;
            auVar149._24_4_ = 0x7f800000;
            auVar149._28_4_ = 0x7f800000;
            auVar94 = vblendmps_avx512vl(auVar149,_local_440);
            auVar124._0_4_ =
                 (uint)(bVar71 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar71 & 1) * 0x7f800000;
            bVar76 = (bool)(bVar71 >> 1 & 1);
            auVar124._4_4_ = (uint)bVar76 * auVar94._4_4_ | (uint)!bVar76 * 0x7f800000;
            bVar76 = (bool)(bVar71 >> 2 & 1);
            auVar124._8_4_ = (uint)bVar76 * auVar94._8_4_ | (uint)!bVar76 * 0x7f800000;
            bVar76 = (bool)(bVar71 >> 3 & 1);
            auVar124._12_4_ = (uint)bVar76 * auVar94._12_4_ | (uint)!bVar76 * 0x7f800000;
            bVar76 = (bool)(bVar71 >> 4 & 1);
            auVar124._16_4_ = (uint)bVar76 * auVar94._16_4_ | (uint)!bVar76 * 0x7f800000;
            bVar76 = (bool)(bVar71 >> 5 & 1);
            auVar124._20_4_ = (uint)bVar76 * auVar94._20_4_ | (uint)!bVar76 * 0x7f800000;
            bVar76 = (bool)(bVar71 >> 6 & 1);
            auVar124._24_4_ = (uint)bVar76 * auVar94._24_4_ | (uint)!bVar76 * 0x7f800000;
            auVar124._28_4_ =
                 (uint)(bVar71 >> 7) * auVar94._28_4_ | (uint)!(bool)(bVar71 >> 7) * 0x7f800000;
            auVar94 = vshufps_avx(auVar124,auVar124,0xb1);
            auVar94 = vminps_avx(auVar124,auVar94);
            auVar95 = vshufpd_avx(auVar94,auVar94,5);
            auVar94 = vminps_avx(auVar94,auVar95);
            auVar95 = vpermpd_avx2(auVar94,0x4e);
            auVar94 = vminps_avx(auVar94,auVar95);
            uVar15 = vcmpps_avx512vl(auVar124,auVar94,0);
            bVar68 = (byte)uVar15 & bVar71;
            bVar74 = bVar71;
            if (bVar68 != 0) {
              bVar74 = bVar68;
            }
            iVar18 = 0;
            for (uVar79 = (uint)bVar74; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x80000000) {
              iVar18 = iVar18 + 1;
            }
            auVar228 = ZEXT464(*(uint *)(local_3a0 + (uint)(iVar18 << 2)));
            auVar226 = ZEXT464(*(uint *)(local_320 + (uint)(iVar18 << 2)));
            aVar1 = (ray->dir).field_0;
            local_500._0_16_ = (undefined1  [16])aVar1;
            auVar82 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
            if (auVar82._0_4_ < 0.0) {
              local_900._0_16_ = ZEXT416(*(uint *)(local_3a0 + (uint)(iVar18 << 2)));
              local_8c0._0_16_ = ZEXT416(*(uint *)(local_320 + (uint)(iVar18 << 2)));
              local_880[1] = 0;
              local_880[0] = bVar71;
              local_880._2_30_ = auVar97._2_30_;
              fVar172 = sqrtf(auVar82._0_4_);
              bVar71 = local_880[0];
              auVar226 = ZEXT1664(local_8c0._0_16_);
              auVar228 = ZEXT1664(local_900._0_16_);
            }
            else {
              auVar82 = vsqrtss_avx(auVar82,auVar82);
              fVar172 = auVar82._0_4_;
            }
            lVar75 = 5;
            do {
              local_8c0._0_16_ = auVar226._0_16_;
              uVar213 = auVar226._0_4_;
              auVar139._4_4_ = uVar213;
              auVar139._0_4_ = uVar213;
              auVar139._8_4_ = uVar213;
              auVar139._12_4_ = uVar213;
              auVar82 = vfmadd132ps_fma(auVar139,ZEXT816(0) << 0x40,local_500._0_16_);
              fVar221 = auVar228._0_4_;
              fVar154 = 1.0 - fVar221;
              fVar217 = fVar221 * fVar221;
              auVar85 = SUB6416(ZEXT464(0x40400000),0);
              auVar84 = SUB6416(ZEXT464(0xc0a00000),0);
              auVar81 = auVar228._0_16_;
              auVar80 = vfmadd213ss_fma(auVar85,auVar81,auVar84);
              auVar83 = vfmadd213ss_fma(auVar80,ZEXT416((uint)fVar217),
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar3 = vfmadd213ss_fma(auVar85,ZEXT416((uint)fVar154),auVar84);
              auVar3 = vfmadd213ss_fma(auVar3,ZEXT416((uint)(fVar154 * fVar154)),
                                       SUB6416(ZEXT464(0x40000000),0));
              fVar218 = fVar154 * fVar154 * -fVar221 * 0.5;
              fVar219 = auVar83._0_4_ * 0.5;
              fVar220 = auVar3._0_4_ * 0.5;
              fVar221 = fVar221 * fVar221 * -fVar154 * 0.5;
              auVar192._0_4_ = fVar221 * (float)local_580._0_4_;
              auVar192._4_4_ = fVar221 * (float)local_580._4_4_;
              auVar192._8_4_ = fVar221 * fStack_578;
              auVar192._12_4_ = fVar221 * fStack_574;
              auVar204._4_4_ = fVar220;
              auVar204._0_4_ = fVar220;
              auVar204._8_4_ = fVar220;
              auVar204._12_4_ = fVar220;
              auVar83 = vfmadd132ps_fma(auVar204,auVar192,local_540._0_16_);
              auVar174._4_4_ = fVar219;
              auVar174._0_4_ = fVar219;
              auVar174._8_4_ = fVar219;
              auVar174._12_4_ = fVar219;
              auVar83 = vfmadd132ps_fma(auVar174,auVar83,local_560._0_16_);
              auVar193._4_4_ = fVar218;
              auVar193._0_4_ = fVar218;
              auVar193._8_4_ = fVar218;
              auVar193._12_4_ = fVar218;
              auVar83 = vfmadd132ps_fma(auVar193,auVar83,local_520._0_16_);
              local_450 = vfmadd231ss_fma(auVar84,auVar81,ZEXT416(0x41100000));
              local_460 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar81,ZEXT416(0x40800000)
                                         );
              local_470 = vfmadd213ss_fma(auVar85,auVar81,ZEXT416(0xbf800000));
              local_420._0_16_ = auVar83;
              auVar82 = vsubps_avx(auVar82,auVar83);
              local_880._0_16_ = auVar82;
              auVar82 = vdpps_avx(auVar82,auVar82,0x7f);
              local_900._0_16_ = auVar81;
              local_8a0._0_16_ = auVar82;
              if (auVar82._0_4_ < 0.0) {
                local_700._0_4_ = auVar80._0_4_;
                local_720._0_16_ = ZEXT416((uint)fVar154);
                local_830._0_4_ = fVar217;
                local_840._0_4_ = fVar154 * -2.0;
                auVar238._0_4_ = sqrtf(auVar82._0_4_);
                auVar238._4_60_ = extraout_var;
                auVar80 = ZEXT416((uint)local_700._0_4_);
                auVar82 = auVar238._0_16_;
                auVar83 = local_720._0_16_;
                auVar81 = local_900._0_16_;
              }
              else {
                auVar82 = vsqrtss_avx(auVar82,auVar82);
                local_840._0_4_ = fVar154 * -2.0;
                local_830._0_4_ = fVar217;
                auVar83 = ZEXT416((uint)fVar154);
              }
              fVar218 = auVar83._0_4_;
              fVar217 = auVar81._0_4_;
              auVar84 = vfnmadd231ss_fma(ZEXT416((uint)(fVar217 * (fVar218 + fVar218))),auVar83,
                                         auVar83);
              auVar83 = vfmadd213ss_fma(auVar80,ZEXT416((uint)(fVar217 + fVar217)),
                                        ZEXT416((uint)(fVar217 * fVar217 * 3.0)));
              auVar80 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar81,
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar3 = vfmadd231ss_fma(ZEXT416((uint)(fVar218 * fVar218 * -3.0)),
                                       ZEXT416((uint)(fVar218 + fVar218)),auVar80);
              auVar80 = vfmadd213ss_fma(ZEXT416((uint)local_840._0_4_),auVar81,
                                        ZEXT416((uint)local_830._0_4_));
              fVar217 = auVar84._0_4_ * 0.5;
              fVar218 = auVar83._0_4_ * 0.5;
              fVar219 = auVar3._0_4_ * 0.5;
              fVar220 = auVar80._0_4_ * 0.5;
              auVar194._0_4_ = fVar220 * (float)local_580._0_4_;
              auVar194._4_4_ = fVar220 * (float)local_580._4_4_;
              auVar194._8_4_ = fVar220 * fStack_578;
              auVar194._12_4_ = fVar220 * fStack_574;
              auVar175._4_4_ = fVar219;
              auVar175._0_4_ = fVar219;
              auVar175._8_4_ = fVar219;
              auVar175._12_4_ = fVar219;
              auVar83 = vfmadd132ps_fma(auVar175,auVar194,local_540._0_16_);
              auVar155._4_4_ = fVar218;
              auVar155._0_4_ = fVar218;
              auVar155._8_4_ = fVar218;
              auVar155._12_4_ = fVar218;
              auVar83 = vfmadd132ps_fma(auVar155,auVar83,local_560._0_16_);
              auVar239._4_4_ = fVar217;
              auVar239._0_4_ = fVar217;
              auVar239._8_4_ = fVar217;
              auVar239._12_4_ = fVar217;
              local_700._0_16_ = vfmadd132ps_fma(auVar239,auVar83,local_520._0_16_);
              local_830 = vdpps_avx(local_700._0_16_,local_700._0_16_,0x7f);
              auVar61._12_4_ = 0;
              auVar61._0_12_ = ZEXT812(0);
              fVar217 = local_830._0_4_;
              local_850 = vrsqrt14ss_avx512f(auVar61 << 0x20,ZEXT416((uint)fVar217));
              fVar218 = local_850._0_4_;
              local_840 = vrcp14ss_avx512f(auVar61 << 0x20,ZEXT416((uint)fVar217));
              auVar19._8_4_ = 0x80000000;
              auVar19._0_8_ = 0x8000000080000000;
              auVar19._12_4_ = 0x80000000;
              auVar80 = vxorps_avx512vl(local_830,auVar19);
              auVar83 = vfnmadd213ss_fma(local_840,local_830,SUB6416(ZEXT464(0x40000000),0));
              local_720._0_4_ = auVar82._0_4_;
              if (fVar217 < auVar80._0_4_) {
                fVar219 = sqrtf(fVar217);
                auVar82 = ZEXT416((uint)local_720._0_4_);
                auVar80 = local_700._0_16_;
              }
              else {
                auVar80 = vsqrtss_avx(local_830,local_830);
                fVar219 = auVar80._0_4_;
                auVar80 = local_700._0_16_;
              }
              fVar220 = local_850._0_4_;
              fVar217 = fVar218 * 1.5 + fVar217 * -0.5 * fVar220 * fVar220 * fVar220;
              local_850._0_4_ = auVar80._0_4_ * fVar217;
              local_850._4_4_ = auVar80._4_4_ * fVar217;
              local_850._8_4_ = auVar80._8_4_ * fVar217;
              local_850._12_4_ = auVar80._12_4_ * fVar217;
              auVar3 = vdpps_avx(local_880._0_16_,local_850,0x7f);
              fVar220 = auVar82._0_4_;
              auVar140._0_4_ = auVar3._0_4_ * auVar3._0_4_;
              auVar140._4_4_ = auVar3._4_4_ * auVar3._4_4_;
              auVar140._8_4_ = auVar3._8_4_ * auVar3._8_4_;
              auVar140._12_4_ = auVar3._12_4_ * auVar3._12_4_;
              auVar84 = vsubps_avx512vl(local_8a0._0_16_,auVar140);
              fVar218 = auVar84._0_4_;
              auVar156._4_12_ = ZEXT812(0) << 0x20;
              auVar156._0_4_ = fVar218;
              auVar81 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar156);
              auVar85 = vmulss_avx512f(auVar81,ZEXT416(0x3fc00000));
              if (fVar218 < 0.0) {
                local_4a0 = fVar217;
                fStack_49c = fVar217;
                fStack_498 = fVar217;
                fStack_494 = fVar217;
                local_490 = auVar81;
                local_480 = auVar3;
                fVar221 = sqrtf(fVar218);
                auVar85 = ZEXT416(auVar85._0_4_);
                auVar82 = ZEXT416((uint)local_720._0_4_);
                auVar80 = local_700._0_16_;
                auVar3 = local_480;
                auVar81 = local_490;
                fVar217 = local_4a0;
                fVar154 = fStack_49c;
                fVar191 = fStack_498;
                fVar230 = fStack_494;
              }
              else {
                auVar84 = vsqrtss_avx(auVar84,auVar84);
                fVar221 = auVar84._0_4_;
                fVar154 = fVar217;
                fVar191 = fVar217;
                fVar230 = fVar217;
              }
              auVar241 = ZEXT1664(auVar80);
              auVar94 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar252 = ZEXT3264(auVar94);
              auVar250 = ZEXT3264(local_780);
              auVar254 = ZEXT3264(local_7a0);
              auVar243 = ZEXT3264(local_7c0);
              auVar244 = ZEXT3264(local_620);
              auVar245 = ZEXT3264(local_640);
              auVar246 = ZEXT3264(local_7e0);
              auVar247 = ZEXT3264(local_660);
              auVar248 = ZEXT3264(local_680);
              auVar249 = ZEXT3264(local_800);
              auVar251 = ZEXT3264(local_6a0);
              auVar253 = ZEXT3264(local_6c0);
              auVar255 = ZEXT3264(local_6e0);
              auVar157._0_4_ = (float)local_470._0_4_ * (float)local_580._0_4_;
              auVar157._4_4_ = (float)local_470._0_4_ * (float)local_580._4_4_;
              auVar157._8_4_ = (float)local_470._0_4_ * fStack_578;
              auVar157._12_4_ = (float)local_470._0_4_ * fStack_574;
              auVar176._4_4_ = local_460._0_4_;
              auVar176._0_4_ = local_460._0_4_;
              auVar176._8_4_ = local_460._0_4_;
              auVar176._12_4_ = local_460._0_4_;
              auVar84 = vfmadd132ps_fma(auVar176,auVar157,local_540._0_16_);
              auVar158._4_4_ = local_450._0_4_;
              auVar158._0_4_ = local_450._0_4_;
              auVar158._8_4_ = local_450._0_4_;
              auVar158._12_4_ = local_450._0_4_;
              auVar84 = vfmadd132ps_fma(auVar158,auVar84,local_560._0_16_);
              auVar4 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),local_900._0_16_,
                                       ZEXT416(0x40000000));
              auVar177._0_4_ = auVar4._0_4_;
              auVar177._4_4_ = auVar177._0_4_;
              auVar177._8_4_ = auVar177._0_4_;
              auVar177._12_4_ = auVar177._0_4_;
              auVar84 = vfmadd132ps_fma(auVar177,auVar84,local_520._0_16_);
              auVar159._0_4_ = auVar84._0_4_ * (float)local_830._0_4_;
              auVar159._4_4_ = auVar84._4_4_ * (float)local_830._0_4_;
              auVar159._8_4_ = auVar84._8_4_ * (float)local_830._0_4_;
              auVar159._12_4_ = auVar84._12_4_ * (float)local_830._0_4_;
              auVar84 = vdpps_avx(auVar80,auVar84,0x7f);
              fVar232 = auVar84._0_4_;
              auVar178._0_4_ = auVar80._0_4_ * fVar232;
              auVar178._4_4_ = auVar80._4_4_ * fVar232;
              auVar178._8_4_ = auVar80._8_4_ * fVar232;
              auVar178._12_4_ = auVar80._12_4_ * fVar232;
              auVar4 = vsubps_avx(auVar159,auVar178);
              fVar232 = auVar83._0_4_ * (float)local_840._0_4_;
              auVar84 = vmaxss_avx(ZEXT416((uint)fVar222),
                                   ZEXT416((uint)((float)local_8c0._0_4_ * fVar172 * 1.9073486e-06))
                                  );
              auVar20._8_4_ = 0x80000000;
              auVar20._0_8_ = 0x8000000080000000;
              auVar20._12_4_ = 0x80000000;
              auVar126._16_16_ = local_6e0._16_16_;
              auVar86 = vxorps_avx512vl(auVar80,auVar20);
              auVar179._0_4_ = fVar217 * auVar4._0_4_ * fVar232;
              auVar179._4_4_ = fVar154 * auVar4._4_4_ * fVar232;
              auVar179._8_4_ = fVar191 * auVar4._8_4_ * fVar232;
              auVar179._12_4_ = fVar230 * auVar4._12_4_ * fVar232;
              auVar238 = ZEXT1664(local_850);
              auVar83 = vdpps_avx(auVar86,local_850,0x7f);
              auVar4 = vfmadd213ss_fma(auVar82,ZEXT416((uint)fVar222),auVar84);
              auVar82 = vdpps_avx(local_880._0_16_,auVar179,0x7f);
              auVar4 = vfmadd213ss_fma(ZEXT416((uint)(fVar220 + 1.0)),
                                       ZEXT416((uint)(fVar222 / fVar219)),auVar4);
              fVar217 = auVar83._0_4_ + auVar82._0_4_;
              auVar82 = vdpps_avx(local_500._0_16_,local_850,0x7f);
              auVar83 = vdpps_avx(local_880._0_16_,auVar86,0x7f);
              fVar219 = auVar81._0_4_;
              auVar87 = vaddss_avx512f(auVar85,ZEXT416((uint)(fVar219 * fVar218 * -0.5 *
                                                             fVar219 * fVar219)));
              auVar81 = vdpps_avx(local_880._0_16_,local_500._0_16_,0x7f);
              auVar85 = vfnmadd231ss_fma(auVar83,auVar3,ZEXT416((uint)fVar217));
              auVar86 = vfnmadd231ss_fma(auVar81,auVar3,auVar82);
              auVar83 = vpermilps_avx(local_420._0_16_,0xff);
              fVar221 = fVar221 - auVar83._0_4_;
              auVar83 = vshufps_avx(auVar80,auVar80,0xff);
              auVar81 = vfmsub213ss_fma(auVar85,auVar87,auVar83);
              fVar218 = auVar86._0_4_ * auVar87._0_4_;
              auVar85 = vfmsub231ss_fma(ZEXT416((uint)(auVar82._0_4_ * auVar81._0_4_)),
                                        ZEXT416((uint)fVar217),ZEXT416((uint)fVar218));
              fVar219 = auVar85._0_4_;
              fVar218 = local_900._0_4_ -
                        (auVar3._0_4_ * (fVar218 / fVar219) - fVar221 * (auVar82._0_4_ / fVar219));
              auVar228 = ZEXT464((uint)fVar218);
              fVar217 = (float)local_8c0._0_4_ -
                        (fVar221 * (fVar217 / fVar219) - auVar3._0_4_ * (auVar81._0_4_ / fVar219));
              auVar226 = ZEXT464((uint)fVar217);
              auVar205._8_4_ = 0x7fffffff;
              auVar205._0_8_ = 0x7fffffff7fffffff;
              auVar205._12_4_ = 0x7fffffff;
              auVar82 = vandps_avx(auVar3,auVar205);
              bVar76 = true;
              if (auVar82._0_4_ < auVar4._0_4_) {
                auVar3 = vfmadd231ss_fma(ZEXT416((uint)(auVar4._0_4_ + auVar84._0_4_)),local_4c0,
                                         ZEXT416(0x36000000));
                auVar82 = vandps_avx(ZEXT416((uint)fVar221),auVar205);
                if (auVar82._0_4_ < auVar3._0_4_) {
                  fVar217 = fVar217 + (float)local_4b0._0_4_;
                  auVar226 = ZEXT464((uint)fVar217);
                  if (((((ray->org).field_0.m128[3] <= fVar217) &&
                       (fVar219 = ray->tfar, fVar217 <= fVar219)) && (0.0 <= fVar218)) &&
                     (fVar218 <= 1.0)) {
                    auVar126._0_16_ = ZEXT816(0) << 0x20;
                    auVar125._4_28_ = auVar126._4_28_;
                    auVar125._0_4_ = local_8a0._0_4_;
                    auVar82 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar125._0_16_);
                    fVar220 = auVar82._0_4_;
                    auVar82 = vmulss_avx512f(local_8a0._0_16_,ZEXT416(0xbf000000));
                    pGVar6 = (context->scene->geometries).items[local_8c8].ptr;
                    if ((pGVar6->mask & ray->mask) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                        unaff_R13 = 1;
                      }
                      else {
                        fVar220 = fVar220 * 1.5 + auVar82._0_4_ * fVar220 * fVar220 * fVar220;
                        auVar160._0_4_ = local_880._0_4_ * fVar220;
                        auVar160._4_4_ = local_880._4_4_ * fVar220;
                        auVar160._8_4_ = local_880._8_4_ * fVar220;
                        auVar160._12_4_ = local_880._12_4_ * fVar220;
                        auVar81 = vfmadd213ps_fma(auVar83,auVar160,auVar80);
                        auVar82 = vshufps_avx(auVar160,auVar160,0xc9);
                        auVar83 = vshufps_avx(auVar80,auVar80,0xc9);
                        auVar161._0_4_ = auVar160._0_4_ * auVar83._0_4_;
                        auVar161._4_4_ = auVar160._4_4_ * auVar83._4_4_;
                        auVar161._8_4_ = auVar160._8_4_ * auVar83._8_4_;
                        auVar161._12_4_ = auVar160._12_4_ * auVar83._12_4_;
                        auVar3 = vfmsub231ps_fma(auVar161,auVar80,auVar82);
                        auVar82 = vshufps_avx(auVar3,auVar3,0xc9);
                        auVar83 = vshufps_avx(auVar81,auVar81,0xc9);
                        auVar3 = vshufps_avx(auVar3,auVar3,0xd2);
                        auVar141._0_4_ = auVar81._0_4_ * auVar3._0_4_;
                        auVar141._4_4_ = auVar81._4_4_ * auVar3._4_4_;
                        auVar141._8_4_ = auVar81._8_4_ * auVar3._8_4_;
                        auVar141._12_4_ = auVar81._12_4_ * auVar3._12_4_;
                        auVar83 = vfmsub231ps_fma(auVar141,auVar82,auVar83);
                        auVar82 = vshufps_avx(auVar83,auVar83,0xe9);
                        local_5f0 = vmovlps_avx(auVar82);
                        local_5e8 = auVar83._0_4_;
                        local_5e0 = 0;
                        local_5dc = (undefined4)local_8d0;
                        local_5d8 = (undefined4)local_8c8;
                        local_5d4 = context->user->instID[0];
                        local_5d0 = context->user->instPrimID[0];
                        ray->tfar = fVar217;
                        local_904 = -1;
                        local_750.valid = &local_904;
                        local_750.geometryUserPtr = pGVar6->userPtr;
                        local_750.context = context->user;
                        local_750.hit = (RTCHitN *)&local_5f0;
                        local_750.N = 1;
                        local_900._0_16_ = ZEXT416((uint)fVar218);
                        local_8c0._0_16_ = ZEXT416((uint)fVar217);
                        local_8a0._0_4_ = fVar219;
                        local_750.ray = (RTCRayN *)ray;
                        local_5e4 = fVar218;
                        if (pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01da8aa6:
                          p_Var7 = context->args->filter;
                          if (p_Var7 != (RTCFilterFunctionN)0x0) {
                            if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar6->field_8).field_0x2 & 0x40) != 0)) {
                              auVar238 = ZEXT1664(auVar238._0_16_);
                              auVar241 = ZEXT1664(auVar241._0_16_);
                              (*p_Var7)(&local_750);
                              auVar226 = ZEXT1664(local_8c0._0_16_);
                              auVar228 = ZEXT1664(local_900._0_16_);
                              auVar255 = ZEXT3264(local_6e0);
                              auVar253 = ZEXT3264(local_6c0);
                              auVar251 = ZEXT3264(local_6a0);
                              auVar249 = ZEXT3264(local_800);
                              auVar248 = ZEXT3264(local_680);
                              auVar247 = ZEXT3264(local_660);
                              auVar246 = ZEXT3264(local_7e0);
                              auVar245 = ZEXT3264(local_640);
                              auVar244 = ZEXT3264(local_620);
                              auVar243 = ZEXT3264(local_7c0);
                              auVar254 = ZEXT3264(local_7a0);
                              auVar250 = ZEXT3264(local_780);
                              auVar205._8_4_ = 0x7fffffff;
                              auVar205._0_8_ = 0x7fffffff7fffffff;
                              auVar205._12_4_ = 0x7fffffff;
                              auVar94 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                              auVar252 = ZEXT3264(auVar94);
                              fVar219 = (float)local_8a0._0_4_;
                            }
                            if (*local_750.valid == 0) goto LAB_01da8b76;
                          }
                          unaff_R13 = 1;
                        }
                        else {
                          auVar238 = ZEXT1664(local_850);
                          auVar241 = ZEXT1664(auVar80);
                          (*pGVar6->occlusionFilterN)(&local_750);
                          auVar226 = ZEXT1664(local_8c0._0_16_);
                          auVar228 = ZEXT1664(local_900._0_16_);
                          auVar255 = ZEXT3264(local_6e0);
                          auVar253 = ZEXT3264(local_6c0);
                          auVar251 = ZEXT3264(local_6a0);
                          auVar249 = ZEXT3264(local_800);
                          auVar248 = ZEXT3264(local_680);
                          auVar247 = ZEXT3264(local_660);
                          auVar246 = ZEXT3264(local_7e0);
                          auVar245 = ZEXT3264(local_640);
                          auVar244 = ZEXT3264(local_620);
                          auVar243 = ZEXT3264(local_7c0);
                          auVar254 = ZEXT3264(local_7a0);
                          auVar250 = ZEXT3264(local_780);
                          auVar205._8_4_ = 0x7fffffff;
                          auVar205._0_8_ = 0x7fffffff7fffffff;
                          auVar205._12_4_ = 0x7fffffff;
                          auVar94 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                          auVar252 = ZEXT3264(auVar94);
                          fVar219 = (float)local_8a0._0_4_;
                          if (*local_750.valid != 0) goto LAB_01da8aa6;
LAB_01da8b76:
                          unaff_R13 = 0;
                        }
                        if ((char)unaff_R13 == '\0') {
                          ray->tfar = fVar219;
                        }
                      }
                      bVar76 = false;
                      goto LAB_01da88c3;
                    }
                  }
                  bVar76 = false;
                  unaff_R13 = 0;
                }
              }
LAB_01da88c3:
              bVar74 = (byte)unaff_R13;
              if (!bVar76) goto LAB_01da8b99;
              lVar75 = lVar75 + -1;
            } while (lVar75 != 0);
            bVar74 = 0;
            auVar205._8_4_ = 0x7fffffff;
            auVar205._0_8_ = 0x7fffffff7fffffff;
            auVar205._12_4_ = 0x7fffffff;
LAB_01da8b99:
            unaff_R13 = (ulong)(bVar74 & 1);
            bVar70 = bVar70 | bVar74 & 1;
            auVar63._4_4_ = fStack_3dc;
            auVar63._0_4_ = local_3e0;
            auVar63._8_4_ = fStack_3d8;
            auVar63._12_4_ = fStack_3d4;
            auVar63._16_4_ = fStack_3d0;
            auVar63._20_4_ = fStack_3cc;
            auVar63._24_4_ = fStack_3c8;
            auVar63._28_4_ = fStack_3c4;
            fVar172 = ray->tfar;
            auVar32._4_4_ = fVar172;
            auVar32._0_4_ = fVar172;
            auVar32._8_4_ = fVar172;
            auVar32._12_4_ = fVar172;
            auVar32._16_4_ = fVar172;
            auVar32._20_4_ = fVar172;
            auVar32._24_4_ = fVar172;
            auVar32._28_4_ = fVar172;
            uVar15 = vcmpps_avx512vl(auVar63,auVar32,2);
            bVar71 = ~('\x01' << ((byte)iVar18 & 0x1f)) & bVar71 & (byte)uVar15;
          } while (bVar71 != 0);
        }
        auVar150._0_4_ = (float)local_5a0._0_4_ + (float)local_400._0_4_;
        auVar150._4_4_ = (float)local_5a0._4_4_ + (float)local_400._4_4_;
        auVar150._8_4_ = fStack_598 + fStack_3f8;
        auVar150._12_4_ = fStack_594 + fStack_3f4;
        auVar150._16_4_ = fStack_590 + fStack_3f0;
        auVar150._20_4_ = fStack_58c + fStack_3ec;
        auVar150._24_4_ = fStack_588 + fStack_3e8;
        auVar150._28_4_ = fStack_584 + fStack_3e4;
        fVar222 = ray->tfar;
        auVar33._4_4_ = fVar222;
        auVar33._0_4_ = fVar222;
        auVar33._8_4_ = fVar222;
        auVar33._12_4_ = fVar222;
        auVar33._16_4_ = fVar222;
        auVar33._20_4_ = fVar222;
        auVar33._24_4_ = fVar222;
        auVar33._28_4_ = fVar222;
        uVar15 = vcmpps_avx512vl(auVar150,auVar33,2);
        bVar74 = (byte)local_804 | (byte)local_80c;
        bVar72 = (byte)uVar16 & bVar72 & (byte)uVar15;
        auVar151._8_4_ = 2;
        auVar151._0_8_ = 0x200000002;
        auVar151._12_4_ = 2;
        auVar151._16_4_ = 2;
        auVar151._20_4_ = 2;
        auVar151._24_4_ = 2;
        auVar151._28_4_ = 2;
        auVar34._8_4_ = 3;
        auVar34._0_8_ = 0x300000003;
        auVar34._12_4_ = 3;
        auVar34._16_4_ = 3;
        auVar34._20_4_ = 3;
        auVar34._24_4_ = 3;
        auVar34._28_4_ = 3;
        auVar94 = vpblendmd_avx512vl(auVar151,auVar34);
        local_400._0_4_ = (uint)(bVar74 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar74 & 1) * 2;
        bVar76 = (bool)(bVar74 >> 1 & 1);
        local_400._4_4_ = (uint)bVar76 * auVar94._4_4_ | (uint)!bVar76 * 2;
        bVar76 = (bool)(bVar74 >> 2 & 1);
        fStack_3f8 = (float)((uint)bVar76 * auVar94._8_4_ | (uint)!bVar76 * 2);
        bVar76 = (bool)(bVar74 >> 3 & 1);
        fStack_3f4 = (float)((uint)bVar76 * auVar94._12_4_ | (uint)!bVar76 * 2);
        bVar76 = (bool)(bVar74 >> 4 & 1);
        fStack_3f0 = (float)((uint)bVar76 * auVar94._16_4_ | (uint)!bVar76 * 2);
        bVar76 = (bool)(bVar74 >> 5 & 1);
        fStack_3ec = (float)((uint)bVar76 * auVar94._20_4_ | (uint)!bVar76 * 2);
        bVar76 = (bool)(bVar74 >> 6 & 1);
        fStack_3e8 = (float)((uint)bVar76 * auVar94._24_4_ | (uint)!bVar76 * 2);
        fStack_3e4 = (float)((uint)(bVar74 >> 7) * auVar94._28_4_ | (uint)!(bool)(bVar74 >> 7) * 2);
        uVar15 = vpcmpd_avx512vl(_local_400,local_380,2);
        bVar74 = (byte)uVar15 & bVar72;
        fVar222 = (float)local_5a0._0_4_;
        fVar172 = (float)local_5a0._4_4_;
        fVar217 = fStack_598;
        fVar218 = fStack_594;
        fVar219 = fStack_590;
        fVar220 = fStack_58c;
        fVar221 = fStack_588;
        fVar154 = fStack_584;
        if (bVar74 != 0) {
          auVar83 = vminps_avx(local_520._0_16_,local_560._0_16_);
          auVar82 = vmaxps_avx(local_520._0_16_,local_560._0_16_);
          auVar80 = vminps_avx(local_540._0_16_,local_580._0_16_);
          auVar3 = vminps_avx(auVar83,auVar80);
          auVar83 = vmaxps_avx(local_540._0_16_,local_580._0_16_);
          auVar80 = vmaxps_avx(auVar82,auVar83);
          auVar82 = vandps_avx(auVar3,auVar205);
          auVar83 = vandps_avx(auVar80,auVar205);
          auVar82 = vmaxps_avx(auVar82,auVar83);
          auVar83 = vmovshdup_avx(auVar82);
          auVar83 = vmaxss_avx(auVar83,auVar82);
          auVar82 = vshufpd_avx(auVar82,auVar82,1);
          auVar82 = vmaxss_avx(auVar82,auVar83);
          fVar191 = auVar82._0_4_ * 1.9073486e-06;
          local_4c0 = vshufps_avx(auVar80,auVar80,0xff);
          _local_440 = _local_2e0;
          local_3e0 = (float)local_5a0._0_4_ + (float)local_2e0._0_4_;
          fStack_3dc = (float)local_5a0._4_4_ + (float)local_2e0._4_4_;
          fStack_3d8 = fStack_598 + fStack_2d8;
          fStack_3d4 = fStack_594 + fStack_2d4;
          fStack_3d0 = fStack_590 + fStack_2d0;
          fStack_3cc = fStack_58c + fStack_2cc;
          fStack_3c8 = fStack_588 + fStack_2c8;
          fStack_3c4 = fStack_584 + fStack_2c4;
          do {
            auVar97 = local_880;
            auVar152._8_4_ = 0x7f800000;
            auVar152._0_8_ = 0x7f8000007f800000;
            auVar152._12_4_ = 0x7f800000;
            auVar152._16_4_ = 0x7f800000;
            auVar152._20_4_ = 0x7f800000;
            auVar152._24_4_ = 0x7f800000;
            auVar152._28_4_ = 0x7f800000;
            auVar94 = vblendmps_avx512vl(auVar152,_local_440);
            auVar127._0_4_ =
                 (uint)(bVar74 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar74 & 1) * 0x7f800000;
            bVar76 = (bool)(bVar74 >> 1 & 1);
            auVar127._4_4_ = (uint)bVar76 * auVar94._4_4_ | (uint)!bVar76 * 0x7f800000;
            bVar76 = (bool)(bVar74 >> 2 & 1);
            auVar127._8_4_ = (uint)bVar76 * auVar94._8_4_ | (uint)!bVar76 * 0x7f800000;
            bVar76 = (bool)(bVar74 >> 3 & 1);
            auVar127._12_4_ = (uint)bVar76 * auVar94._12_4_ | (uint)!bVar76 * 0x7f800000;
            bVar76 = (bool)(bVar74 >> 4 & 1);
            auVar127._16_4_ = (uint)bVar76 * auVar94._16_4_ | (uint)!bVar76 * 0x7f800000;
            bVar76 = (bool)(bVar74 >> 5 & 1);
            auVar127._20_4_ = (uint)bVar76 * auVar94._20_4_ | (uint)!bVar76 * 0x7f800000;
            bVar76 = (bool)(bVar74 >> 6 & 1);
            auVar127._24_4_ = (uint)bVar76 * auVar94._24_4_ | (uint)!bVar76 * 0x7f800000;
            auVar127._28_4_ =
                 (uint)(bVar74 >> 7) * auVar94._28_4_ | (uint)!(bool)(bVar74 >> 7) * 0x7f800000;
            auVar94 = vshufps_avx(auVar127,auVar127,0xb1);
            auVar94 = vminps_avx(auVar127,auVar94);
            auVar95 = vshufpd_avx(auVar94,auVar94,5);
            auVar94 = vminps_avx(auVar94,auVar95);
            auVar95 = vpermpd_avx2(auVar94,0x4e);
            auVar94 = vminps_avx(auVar94,auVar95);
            uVar15 = vcmpps_avx512vl(auVar127,auVar94,0);
            bVar68 = (byte)uVar15 & bVar74;
            bVar71 = bVar74;
            if (bVar68 != 0) {
              bVar71 = bVar68;
            }
            iVar18 = 0;
            for (uVar79 = (uint)bVar71; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x80000000) {
              iVar18 = iVar18 + 1;
            }
            auVar228 = ZEXT464(*(uint *)(local_3c0 + (uint)(iVar18 << 2)));
            auVar226 = ZEXT464(*(uint *)(local_2c0 + (uint)(iVar18 << 2)));
            aVar1 = (ray->dir).field_0;
            local_500._0_16_ = (undefined1  [16])aVar1;
            auVar82 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
            if (auVar82._0_4_ < 0.0) {
              local_900._0_16_ = ZEXT416(*(uint *)(local_3c0 + (uint)(iVar18 << 2)));
              local_8c0._0_16_ = ZEXT416(*(uint *)(local_2c0 + (uint)(iVar18 << 2)));
              local_880[1] = 0;
              local_880[0] = bVar74;
              local_880._2_30_ = auVar97._2_30_;
              fVar230 = sqrtf(auVar82._0_4_);
              bVar74 = local_880[0];
              auVar226 = ZEXT1664(local_8c0._0_16_);
              auVar228 = ZEXT1664(local_900._0_16_);
            }
            else {
              auVar82 = vsqrtss_avx(auVar82,auVar82);
              fVar230 = auVar82._0_4_;
            }
            lVar75 = 5;
            do {
              local_8c0._0_16_ = auVar226._0_16_;
              uVar213 = auVar226._0_4_;
              auVar142._4_4_ = uVar213;
              auVar142._0_4_ = uVar213;
              auVar142._8_4_ = uVar213;
              auVar142._12_4_ = uVar213;
              auVar82 = vfmadd132ps_fma(auVar142,ZEXT816(0) << 0x40,local_500._0_16_);
              fVar219 = auVar228._0_4_;
              fVar220 = 1.0 - fVar219;
              fVar222 = fVar219 * fVar219;
              auVar85 = SUB6416(ZEXT464(0x40400000),0);
              auVar84 = SUB6416(ZEXT464(0xc0a00000),0);
              auVar81 = auVar228._0_16_;
              auVar80 = vfmadd213ss_fma(auVar85,auVar81,auVar84);
              auVar83 = vfmadd213ss_fma(auVar80,ZEXT416((uint)fVar222),
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar3 = vfmadd213ss_fma(auVar85,ZEXT416((uint)fVar220),auVar84);
              auVar3 = vfmadd213ss_fma(auVar3,ZEXT416((uint)(fVar220 * fVar220)),
                                       SUB6416(ZEXT464(0x40000000),0));
              fVar172 = fVar220 * fVar220 * -fVar219 * 0.5;
              fVar217 = auVar83._0_4_ * 0.5;
              fVar218 = auVar3._0_4_ * 0.5;
              fVar219 = fVar219 * fVar219 * -fVar220 * 0.5;
              auVar195._0_4_ = fVar219 * (float)local_580._0_4_;
              auVar195._4_4_ = fVar219 * (float)local_580._4_4_;
              auVar195._8_4_ = fVar219 * fStack_578;
              auVar195._12_4_ = fVar219 * fStack_574;
              auVar206._4_4_ = fVar218;
              auVar206._0_4_ = fVar218;
              auVar206._8_4_ = fVar218;
              auVar206._12_4_ = fVar218;
              auVar83 = vfmadd132ps_fma(auVar206,auVar195,local_540._0_16_);
              auVar180._4_4_ = fVar217;
              auVar180._0_4_ = fVar217;
              auVar180._8_4_ = fVar217;
              auVar180._12_4_ = fVar217;
              auVar83 = vfmadd132ps_fma(auVar180,auVar83,local_560._0_16_);
              auVar196._4_4_ = fVar172;
              auVar196._0_4_ = fVar172;
              auVar196._8_4_ = fVar172;
              auVar196._12_4_ = fVar172;
              auVar83 = vfmadd132ps_fma(auVar196,auVar83,local_520._0_16_);
              local_450 = vfmadd231ss_fma(auVar84,auVar81,ZEXT416(0x41100000));
              local_460 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar81,ZEXT416(0x40800000)
                                         );
              local_470 = vfmadd213ss_fma(auVar85,auVar81,ZEXT416(0xbf800000));
              local_420._0_16_ = auVar83;
              auVar82 = vsubps_avx(auVar82,auVar83);
              local_880._0_16_ = auVar82;
              auVar82 = vdpps_avx(auVar82,auVar82,0x7f);
              local_900._0_16_ = auVar81;
              local_8a0._0_16_ = auVar82;
              if (auVar82._0_4_ < 0.0) {
                local_700._0_4_ = auVar80._0_4_;
                local_720._0_16_ = ZEXT416((uint)fVar220);
                local_830._0_4_ = fVar222;
                local_840._0_4_ = fVar220 * -2.0;
                auVar241._0_4_ = sqrtf(auVar82._0_4_);
                auVar241._4_60_ = extraout_var_00;
                auVar80 = ZEXT416((uint)local_700._0_4_);
                auVar82 = auVar241._0_16_;
                auVar83 = local_720._0_16_;
                auVar81 = local_900._0_16_;
              }
              else {
                auVar82 = vsqrtss_avx(auVar82,auVar82);
                local_840._0_4_ = fVar220 * -2.0;
                local_830._0_4_ = fVar222;
                auVar83 = ZEXT416((uint)fVar220);
              }
              fVar172 = auVar83._0_4_;
              fVar222 = auVar81._0_4_;
              auVar84 = vfnmadd231ss_fma(ZEXT416((uint)(fVar222 * (fVar172 + fVar172))),auVar83,
                                         auVar83);
              auVar83 = vfmadd213ss_fma(auVar80,ZEXT416((uint)(fVar222 + fVar222)),
                                        ZEXT416((uint)(fVar222 * fVar222 * 3.0)));
              auVar80 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar81,
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar3 = vfmadd231ss_fma(ZEXT416((uint)(fVar172 * fVar172 * -3.0)),
                                       ZEXT416((uint)(fVar172 + fVar172)),auVar80);
              auVar80 = vfmadd213ss_fma(ZEXT416((uint)local_840._0_4_),auVar81,
                                        ZEXT416((uint)local_830._0_4_));
              fVar222 = auVar84._0_4_ * 0.5;
              fVar172 = auVar83._0_4_ * 0.5;
              fVar217 = auVar3._0_4_ * 0.5;
              fVar218 = auVar80._0_4_ * 0.5;
              auVar197._0_4_ = fVar218 * (float)local_580._0_4_;
              auVar197._4_4_ = fVar218 * (float)local_580._4_4_;
              auVar197._8_4_ = fVar218 * fStack_578;
              auVar197._12_4_ = fVar218 * fStack_574;
              auVar181._4_4_ = fVar217;
              auVar181._0_4_ = fVar217;
              auVar181._8_4_ = fVar217;
              auVar181._12_4_ = fVar217;
              auVar83 = vfmadd132ps_fma(auVar181,auVar197,local_540._0_16_);
              auVar162._4_4_ = fVar172;
              auVar162._0_4_ = fVar172;
              auVar162._8_4_ = fVar172;
              auVar162._12_4_ = fVar172;
              auVar83 = vfmadd132ps_fma(auVar162,auVar83,local_560._0_16_);
              auVar240._4_4_ = fVar222;
              auVar240._0_4_ = fVar222;
              auVar240._8_4_ = fVar222;
              auVar240._12_4_ = fVar222;
              local_700._0_16_ = vfmadd132ps_fma(auVar240,auVar83,local_520._0_16_);
              local_830 = vdpps_avx(local_700._0_16_,local_700._0_16_,0x7f);
              auVar62._12_4_ = 0;
              auVar62._0_12_ = ZEXT812(0);
              fVar222 = local_830._0_4_;
              local_850 = vrsqrt14ss_avx512f(auVar62 << 0x20,ZEXT416((uint)fVar222));
              fVar172 = local_850._0_4_;
              local_840 = vrcp14ss_avx512f(auVar62 << 0x20,ZEXT416((uint)fVar222));
              auVar21._8_4_ = 0x80000000;
              auVar21._0_8_ = 0x8000000080000000;
              auVar21._12_4_ = 0x80000000;
              auVar80 = vxorps_avx512vl(local_830,auVar21);
              auVar83 = vfnmadd213ss_fma(local_840,local_830,SUB6416(ZEXT464(0x40000000),0));
              local_720._0_4_ = auVar82._0_4_;
              if (fVar222 < auVar80._0_4_) {
                fVar217 = sqrtf(fVar222);
                auVar82 = ZEXT416((uint)local_720._0_4_);
                auVar80 = local_700._0_16_;
              }
              else {
                auVar80 = vsqrtss_avx(local_830,local_830);
                fVar217 = auVar80._0_4_;
                auVar80 = local_700._0_16_;
              }
              fVar218 = local_850._0_4_;
              fVar222 = fVar172 * 1.5 + fVar222 * -0.5 * fVar218 * fVar218 * fVar218;
              local_850._0_4_ = auVar80._0_4_ * fVar222;
              local_850._4_4_ = auVar80._4_4_ * fVar222;
              local_850._8_4_ = auVar80._8_4_ * fVar222;
              local_850._12_4_ = auVar80._12_4_ * fVar222;
              auVar3 = vdpps_avx(local_880._0_16_,local_850,0x7f);
              fVar218 = auVar82._0_4_;
              auVar143._0_4_ = auVar3._0_4_ * auVar3._0_4_;
              auVar143._4_4_ = auVar3._4_4_ * auVar3._4_4_;
              auVar143._8_4_ = auVar3._8_4_ * auVar3._8_4_;
              auVar143._12_4_ = auVar3._12_4_ * auVar3._12_4_;
              auVar84 = vsubps_avx512vl(local_8a0._0_16_,auVar143);
              fVar172 = auVar84._0_4_;
              auVar163._4_12_ = ZEXT812(0) << 0x20;
              auVar163._0_4_ = fVar172;
              auVar81 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar163);
              auVar85 = vmulss_avx512f(auVar81,ZEXT416(0x3fc00000));
              if (fVar172 < 0.0) {
                local_4a0 = fVar222;
                fStack_49c = fVar222;
                fStack_498 = fVar222;
                fStack_494 = fVar222;
                local_490 = auVar81;
                local_480 = auVar3;
                fVar232 = sqrtf(fVar172);
                auVar85 = ZEXT416(auVar85._0_4_);
                auVar82 = ZEXT416((uint)local_720._0_4_);
                auVar80 = local_700._0_16_;
                auVar3 = local_480;
                auVar81 = local_490;
                fVar222 = local_4a0;
                fVar219 = fStack_49c;
                fVar220 = fStack_498;
                fVar221 = fStack_494;
              }
              else {
                auVar84 = vsqrtss_avx(auVar84,auVar84);
                fVar232 = auVar84._0_4_;
                fVar219 = fVar222;
                fVar220 = fVar222;
                fVar221 = fVar222;
              }
              auVar241 = ZEXT1664(auVar80);
              auVar94 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar252 = ZEXT3264(auVar94);
              auVar250 = ZEXT3264(local_780);
              auVar254 = ZEXT3264(local_7a0);
              auVar243 = ZEXT3264(local_7c0);
              auVar244 = ZEXT3264(local_620);
              auVar245 = ZEXT3264(local_640);
              auVar246 = ZEXT3264(local_7e0);
              auVar247 = ZEXT3264(local_660);
              auVar248 = ZEXT3264(local_680);
              auVar249 = ZEXT3264(local_800);
              auVar251 = ZEXT3264(local_6a0);
              auVar253 = ZEXT3264(local_6c0);
              auVar255 = ZEXT3264(local_6e0);
              auVar164._0_4_ = (float)local_470._0_4_ * (float)local_580._0_4_;
              auVar164._4_4_ = (float)local_470._0_4_ * (float)local_580._4_4_;
              auVar164._8_4_ = (float)local_470._0_4_ * fStack_578;
              auVar164._12_4_ = (float)local_470._0_4_ * fStack_574;
              auVar182._4_4_ = local_460._0_4_;
              auVar182._0_4_ = local_460._0_4_;
              auVar182._8_4_ = local_460._0_4_;
              auVar182._12_4_ = local_460._0_4_;
              auVar84 = vfmadd132ps_fma(auVar182,auVar164,local_540._0_16_);
              auVar165._4_4_ = local_450._0_4_;
              auVar165._0_4_ = local_450._0_4_;
              auVar165._8_4_ = local_450._0_4_;
              auVar165._12_4_ = local_450._0_4_;
              auVar84 = vfmadd132ps_fma(auVar165,auVar84,local_560._0_16_);
              auVar4 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),local_900._0_16_,
                                       ZEXT416(0x40000000));
              auVar183._0_4_ = auVar4._0_4_;
              auVar183._4_4_ = auVar183._0_4_;
              auVar183._8_4_ = auVar183._0_4_;
              auVar183._12_4_ = auVar183._0_4_;
              auVar84 = vfmadd132ps_fma(auVar183,auVar84,local_520._0_16_);
              auVar166._0_4_ = auVar84._0_4_ * (float)local_830._0_4_;
              auVar166._4_4_ = auVar84._4_4_ * (float)local_830._0_4_;
              auVar166._8_4_ = auVar84._8_4_ * (float)local_830._0_4_;
              auVar166._12_4_ = auVar84._12_4_ * (float)local_830._0_4_;
              auVar84 = vdpps_avx(auVar80,auVar84,0x7f);
              fVar154 = auVar84._0_4_;
              auVar184._0_4_ = auVar80._0_4_ * fVar154;
              auVar184._4_4_ = auVar80._4_4_ * fVar154;
              auVar184._8_4_ = auVar80._8_4_ * fVar154;
              auVar184._12_4_ = auVar80._12_4_ * fVar154;
              auVar4 = vsubps_avx(auVar166,auVar184);
              fVar154 = auVar83._0_4_ * (float)local_840._0_4_;
              auVar84 = vmaxss_avx(ZEXT416((uint)fVar191),
                                   ZEXT416((uint)((float)local_8c0._0_4_ * fVar230 * 1.9073486e-06))
                                  );
              auVar22._8_4_ = 0x80000000;
              auVar22._0_8_ = 0x8000000080000000;
              auVar22._12_4_ = 0x80000000;
              auVar129._16_16_ = local_6e0._16_16_;
              auVar86 = vxorps_avx512vl(auVar80,auVar22);
              auVar185._0_4_ = fVar222 * auVar4._0_4_ * fVar154;
              auVar185._4_4_ = fVar219 * auVar4._4_4_ * fVar154;
              auVar185._8_4_ = fVar220 * auVar4._8_4_ * fVar154;
              auVar185._12_4_ = fVar221 * auVar4._12_4_ * fVar154;
              auVar238 = ZEXT1664(local_850);
              auVar83 = vdpps_avx(auVar86,local_850,0x7f);
              auVar4 = vfmadd213ss_fma(auVar82,ZEXT416((uint)fVar191),auVar84);
              auVar82 = vdpps_avx(local_880._0_16_,auVar185,0x7f);
              auVar4 = vfmadd213ss_fma(ZEXT416((uint)(fVar218 + 1.0)),
                                       ZEXT416((uint)(fVar191 / fVar217)),auVar4);
              fVar222 = auVar83._0_4_ + auVar82._0_4_;
              auVar82 = vdpps_avx(local_500._0_16_,local_850,0x7f);
              auVar83 = vdpps_avx(local_880._0_16_,auVar86,0x7f);
              fVar217 = auVar81._0_4_;
              auVar87 = vaddss_avx512f(auVar85,ZEXT416((uint)(fVar217 * fVar172 * -0.5 *
                                                             fVar217 * fVar217)));
              auVar81 = vdpps_avx(local_880._0_16_,local_500._0_16_,0x7f);
              auVar85 = vfnmadd231ss_fma(auVar83,auVar3,ZEXT416((uint)fVar222));
              auVar86 = vfnmadd231ss_fma(auVar81,auVar3,auVar82);
              auVar83 = vpermilps_avx(local_420._0_16_,0xff);
              fVar232 = fVar232 - auVar83._0_4_;
              auVar83 = vshufps_avx(auVar80,auVar80,0xff);
              auVar81 = vfmsub213ss_fma(auVar85,auVar87,auVar83);
              fVar172 = auVar86._0_4_ * auVar87._0_4_;
              auVar85 = vfmsub231ss_fma(ZEXT416((uint)(auVar82._0_4_ * auVar81._0_4_)),
                                        ZEXT416((uint)fVar222),ZEXT416((uint)fVar172));
              fVar217 = auVar85._0_4_;
              fVar235 = local_900._0_4_ -
                        (auVar3._0_4_ * (fVar172 / fVar217) - fVar232 * (auVar82._0_4_ / fVar217));
              auVar228 = ZEXT464((uint)fVar235);
              fVar234 = (float)local_8c0._0_4_ -
                        (fVar232 * (fVar222 / fVar217) - auVar3._0_4_ * (auVar81._0_4_ / fVar217));
              auVar226 = ZEXT464((uint)fVar234);
              auVar207._8_4_ = 0x7fffffff;
              auVar207._0_8_ = 0x7fffffff7fffffff;
              auVar207._12_4_ = 0x7fffffff;
              auVar82 = vandps_avx(auVar3,auVar207);
              bVar76 = true;
              fVar222 = (float)local_5a0._0_4_;
              fVar172 = (float)local_5a0._4_4_;
              fVar217 = fStack_598;
              fVar218 = fStack_594;
              fVar219 = fStack_590;
              fVar220 = fStack_58c;
              fVar221 = fStack_588;
              fVar154 = fStack_584;
              if (auVar82._0_4_ < auVar4._0_4_) {
                auVar3 = vfmadd231ss_fma(ZEXT416((uint)(auVar4._0_4_ + auVar84._0_4_)),local_4c0,
                                         ZEXT416(0x36000000));
                auVar82 = vandps_avx(ZEXT416((uint)fVar232),auVar207);
                if (auVar82._0_4_ < auVar3._0_4_) {
                  fVar234 = fVar234 + (float)local_4b0._0_4_;
                  auVar226 = ZEXT464((uint)fVar234);
                  if (((((ray->org).field_0.m128[3] <= fVar234) &&
                       (fVar232 = ray->tfar, fVar234 <= fVar232)) && (0.0 <= fVar235)) &&
                     (fVar235 <= 1.0)) {
                    auVar129._0_16_ = ZEXT816(0) << 0x20;
                    auVar128._4_28_ = auVar129._4_28_;
                    auVar128._0_4_ = local_8a0._0_4_;
                    auVar82 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar128._0_16_);
                    fVar227 = auVar82._0_4_;
                    auVar82 = vmulss_avx512f(local_8a0._0_16_,ZEXT416(0xbf000000));
                    pGVar6 = (context->scene->geometries).items[local_8c8].ptr;
                    if ((pGVar6->mask & ray->mask) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                        unaff_R13 = 1;
                      }
                      else {
                        fVar222 = fVar227 * 1.5 + auVar82._0_4_ * fVar227 * fVar227 * fVar227;
                        auVar167._0_4_ = local_880._0_4_ * fVar222;
                        auVar167._4_4_ = local_880._4_4_ * fVar222;
                        auVar167._8_4_ = local_880._8_4_ * fVar222;
                        auVar167._12_4_ = local_880._12_4_ * fVar222;
                        auVar81 = vfmadd213ps_fma(auVar83,auVar167,auVar80);
                        auVar82 = vshufps_avx(auVar167,auVar167,0xc9);
                        auVar83 = vshufps_avx(auVar80,auVar80,0xc9);
                        auVar168._0_4_ = auVar167._0_4_ * auVar83._0_4_;
                        auVar168._4_4_ = auVar167._4_4_ * auVar83._4_4_;
                        auVar168._8_4_ = auVar167._8_4_ * auVar83._8_4_;
                        auVar168._12_4_ = auVar167._12_4_ * auVar83._12_4_;
                        auVar3 = vfmsub231ps_fma(auVar168,auVar80,auVar82);
                        auVar82 = vshufps_avx(auVar3,auVar3,0xc9);
                        auVar83 = vshufps_avx(auVar81,auVar81,0xc9);
                        auVar3 = vshufps_avx(auVar3,auVar3,0xd2);
                        auVar144._0_4_ = auVar81._0_4_ * auVar3._0_4_;
                        auVar144._4_4_ = auVar81._4_4_ * auVar3._4_4_;
                        auVar144._8_4_ = auVar81._8_4_ * auVar3._8_4_;
                        auVar144._12_4_ = auVar81._12_4_ * auVar3._12_4_;
                        auVar83 = vfmsub231ps_fma(auVar144,auVar82,auVar83);
                        auVar82 = vshufps_avx(auVar83,auVar83,0xe9);
                        local_5f0 = vmovlps_avx(auVar82);
                        local_5e8 = auVar83._0_4_;
                        local_5e0 = 0;
                        local_5dc = (undefined4)local_8d0;
                        local_5d8 = (undefined4)local_8c8;
                        local_5d4 = context->user->instID[0];
                        local_5d0 = context->user->instPrimID[0];
                        ray->tfar = fVar234;
                        local_904 = -1;
                        local_750.valid = &local_904;
                        local_750.geometryUserPtr = pGVar6->userPtr;
                        local_750.context = context->user;
                        local_750.hit = (RTCHitN *)&local_5f0;
                        local_750.N = 1;
                        local_900._0_16_ = ZEXT416((uint)fVar235);
                        local_8c0._0_16_ = ZEXT416((uint)fVar234);
                        local_8a0._0_4_ = fVar232;
                        local_750.ray = (RTCRayN *)ray;
                        local_5e4 = fVar235;
                        if (pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01da96b6:
                          p_Var7 = context->args->filter;
                          fVar222 = (float)local_5a0._0_4_;
                          fVar172 = (float)local_5a0._4_4_;
                          fVar217 = fStack_598;
                          fVar218 = fStack_594;
                          fVar219 = fStack_590;
                          fVar220 = fStack_58c;
                          fVar221 = fStack_588;
                          fVar154 = fStack_584;
                          if (p_Var7 != (RTCFilterFunctionN)0x0) {
                            if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar6->field_8).field_0x2 & 0x40) != 0)) {
                              auVar238 = ZEXT1664(auVar238._0_16_);
                              auVar241 = ZEXT1664(auVar241._0_16_);
                              (*p_Var7)(&local_750);
                              auVar226 = ZEXT1664(local_8c0._0_16_);
                              auVar228 = ZEXT1664(local_900._0_16_);
                              auVar255 = ZEXT3264(local_6e0);
                              auVar253 = ZEXT3264(local_6c0);
                              auVar251 = ZEXT3264(local_6a0);
                              auVar249 = ZEXT3264(local_800);
                              auVar248 = ZEXT3264(local_680);
                              auVar247 = ZEXT3264(local_660);
                              auVar246 = ZEXT3264(local_7e0);
                              auVar245 = ZEXT3264(local_640);
                              auVar244 = ZEXT3264(local_620);
                              auVar243 = ZEXT3264(local_7c0);
                              auVar254 = ZEXT3264(local_7a0);
                              auVar250 = ZEXT3264(local_780);
                              auVar94 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                              auVar252 = ZEXT3264(auVar94);
                              fVar222 = (float)local_5a0._0_4_;
                              fVar172 = (float)local_5a0._4_4_;
                              fVar217 = fStack_598;
                              fVar218 = fStack_594;
                              fVar219 = fStack_590;
                              fVar220 = fStack_58c;
                              fVar221 = fStack_588;
                              fVar154 = fStack_584;
                              fVar232 = (float)local_8a0._0_4_;
                            }
                            if (*local_750.valid == 0) goto LAB_01da9786;
                          }
                          unaff_R13 = 1;
                        }
                        else {
                          auVar238 = ZEXT1664(local_850);
                          auVar241 = ZEXT1664(auVar80);
                          (*pGVar6->occlusionFilterN)(&local_750);
                          auVar226 = ZEXT1664(local_8c0._0_16_);
                          auVar228 = ZEXT1664(local_900._0_16_);
                          auVar255 = ZEXT3264(local_6e0);
                          auVar253 = ZEXT3264(local_6c0);
                          auVar251 = ZEXT3264(local_6a0);
                          auVar249 = ZEXT3264(local_800);
                          auVar248 = ZEXT3264(local_680);
                          auVar247 = ZEXT3264(local_660);
                          auVar246 = ZEXT3264(local_7e0);
                          auVar245 = ZEXT3264(local_640);
                          auVar244 = ZEXT3264(local_620);
                          auVar243 = ZEXT3264(local_7c0);
                          auVar254 = ZEXT3264(local_7a0);
                          auVar250 = ZEXT3264(local_780);
                          auVar94 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                          auVar252 = ZEXT3264(auVar94);
                          fVar222 = (float)local_5a0._0_4_;
                          fVar172 = (float)local_5a0._4_4_;
                          fVar217 = fStack_598;
                          fVar218 = fStack_594;
                          fVar219 = fStack_590;
                          fVar220 = fStack_58c;
                          fVar221 = fStack_588;
                          fVar154 = fStack_584;
                          fVar232 = (float)local_8a0._0_4_;
                          if (*local_750.valid != 0) goto LAB_01da96b6;
LAB_01da9786:
                          unaff_R13 = 0;
                        }
                        if ((char)unaff_R13 == '\0') {
                          ray->tfar = fVar232;
                        }
                      }
                      bVar76 = false;
                      goto LAB_01da94d3;
                    }
                  }
                  bVar76 = false;
                  unaff_R13 = 0;
                }
              }
LAB_01da94d3:
              bVar71 = (byte)unaff_R13;
              if (!bVar76) goto LAB_01da97a0;
              lVar75 = lVar75 + -1;
            } while (lVar75 != 0);
            bVar71 = 0;
LAB_01da97a0:
            unaff_R13 = (ulong)(bVar71 & 1);
            bVar70 = bVar70 | bVar71 & 1;
            auVar64._4_4_ = fStack_3dc;
            auVar64._0_4_ = local_3e0;
            auVar64._8_4_ = fStack_3d8;
            auVar64._12_4_ = fStack_3d4;
            auVar64._16_4_ = fStack_3d0;
            auVar64._20_4_ = fStack_3cc;
            auVar64._24_4_ = fStack_3c8;
            auVar64._28_4_ = fStack_3c4;
            fVar230 = ray->tfar;
            auVar35._4_4_ = fVar230;
            auVar35._0_4_ = fVar230;
            auVar35._8_4_ = fVar230;
            auVar35._12_4_ = fVar230;
            auVar35._16_4_ = fVar230;
            auVar35._20_4_ = fVar230;
            auVar35._24_4_ = fVar230;
            auVar35._28_4_ = fVar230;
            uVar15 = vcmpps_avx512vl(auVar64,auVar35,2);
            bVar74 = ~('\x01' << ((byte)iVar18 & 0x1f)) & bVar74 & (byte)uVar15;
          } while (bVar74 != 0);
        }
        uVar16 = vpcmpd_avx512vl(local_380,_local_400,1);
        uVar17 = vpcmpd_avx512vl(local_380,local_2a0,1);
        auVar170._0_4_ = fVar222 + (float)local_320._0_4_;
        auVar170._4_4_ = fVar172 + (float)local_320._4_4_;
        auVar170._8_4_ = fVar217 + fStack_318;
        auVar170._12_4_ = fVar218 + fStack_314;
        auVar170._16_4_ = fVar219 + fStack_310;
        auVar170._20_4_ = fVar220 + fStack_30c;
        auVar170._24_4_ = fVar221 + fStack_308;
        auVar170._28_4_ = fVar154 + fStack_304;
        fVar191 = ray->tfar;
        auVar187._4_4_ = fVar191;
        auVar187._0_4_ = fVar191;
        auVar187._8_4_ = fVar191;
        auVar187._12_4_ = fVar191;
        auVar187._16_4_ = fVar191;
        auVar187._20_4_ = fVar191;
        auVar187._24_4_ = fVar191;
        auVar187._28_4_ = fVar191;
        uVar15 = vcmpps_avx512vl(auVar170,auVar187,2);
        bVar74 = (byte)local_808 & (byte)uVar17 & (byte)uVar15;
        auVar202._0_4_ = fVar222 + (float)local_2e0._0_4_;
        auVar202._4_4_ = fVar172 + (float)local_2e0._4_4_;
        auVar202._8_4_ = fVar217 + fStack_2d8;
        auVar202._12_4_ = fVar218 + fStack_2d4;
        auVar202._16_4_ = fVar219 + fStack_2d0;
        auVar202._20_4_ = fVar220 + fStack_2cc;
        auVar202._24_4_ = fVar221 + fStack_2c8;
        auVar202._28_4_ = fVar154 + fStack_2c4;
        uVar15 = vcmpps_avx512vl(auVar202,auVar187,2);
        bVar72 = bVar72 & (byte)uVar16 & (byte)uVar15 | bVar74;
        if (bVar72 != 0) {
          uVar78 = local_5a8 & 0xffffffff;
          abStack_180[uVar78 * 0x60] = bVar72;
          auVar130._0_4_ =
               (uint)(bVar74 & 1) * local_320._0_4_ | (uint)!(bool)(bVar74 & 1) * local_2e0._0_4_;
          bVar76 = (bool)(bVar74 >> 1 & 1);
          auVar130._4_4_ = (uint)bVar76 * local_320._4_4_ | (uint)!bVar76 * local_2e0._4_4_;
          bVar76 = (bool)(bVar74 >> 2 & 1);
          auVar130._8_4_ = (uint)bVar76 * (int)fStack_318 | (uint)!bVar76 * (int)fStack_2d8;
          bVar76 = (bool)(bVar74 >> 3 & 1);
          auVar130._12_4_ = (uint)bVar76 * (int)fStack_314 | (uint)!bVar76 * (int)fStack_2d4;
          bVar76 = (bool)(bVar74 >> 4 & 1);
          auVar130._16_4_ = (uint)bVar76 * (int)fStack_310 | (uint)!bVar76 * (int)fStack_2d0;
          bVar76 = (bool)(bVar74 >> 5 & 1);
          auVar130._20_4_ = (uint)bVar76 * (int)fStack_30c | (uint)!bVar76 * (int)fStack_2cc;
          bVar76 = (bool)(bVar74 >> 6 & 1);
          auVar130._24_4_ = (uint)bVar76 * (int)fStack_308 | (uint)!bVar76 * (int)fStack_2c8;
          auVar130._28_4_ =
               (uint)(bVar74 >> 7) * (int)fStack_304 | (uint)!(bool)(bVar74 >> 7) * (int)fStack_2c4;
          *(undefined1 (*) [32])(auStack_160 + uVar78 * 0x60) = auVar130;
          uVar15 = vmovlps_avx(local_4d0);
          *(undefined8 *)(afStack_140 + uVar78 * 0x18) = uVar15;
          auStack_138[uVar78 * 0x18] = (int)local_818 + 1;
          local_5a8 = (ulong)((int)local_5a8 + 1);
        }
        auVar203 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                       &
                                                  DAT_3f8000003f800000)))))));
        prim = local_5b8;
      }
    }
    fVar191 = ray->tfar;
    auVar153._4_4_ = fVar191;
    auVar153._0_4_ = fVar191;
    auVar153._8_4_ = fVar191;
    auVar153._12_4_ = fVar191;
    auVar153._16_4_ = fVar191;
    auVar153._20_4_ = fVar191;
    auVar153._24_4_ = fVar191;
    auVar153._28_4_ = fVar191;
    uVar78 = local_5a8;
    do {
      if ((int)uVar78 == 0) {
        if (bVar70 != 0) {
          return bVar77;
        }
        fVar222 = ray->tfar;
        auVar36._4_4_ = fVar222;
        auVar36._0_4_ = fVar222;
        auVar36._8_4_ = fVar222;
        auVar36._12_4_ = fVar222;
        auVar36._16_4_ = fVar222;
        auVar36._20_4_ = fVar222;
        auVar36._24_4_ = fVar222;
        auVar36._28_4_ = fVar222;
        uVar15 = vcmpps_avx512vl(local_280,auVar36,2);
        uVar79 = (uint)local_5b0 & (uint)uVar15;
        local_5b0 = (ulong)uVar79;
        bVar77 = uVar79 != 0;
        if (!bVar77) {
          return bVar77;
        }
        goto LAB_01da7148;
      }
      uVar69 = (ulong)((int)uVar78 - 1);
      lVar75 = uVar69 * 0x60;
      auVar94 = *(undefined1 (*) [32])(auStack_160 + lVar75);
      auVar188._0_4_ = fVar222 + auVar94._0_4_;
      auVar188._4_4_ = fVar172 + auVar94._4_4_;
      auVar188._8_4_ = fVar217 + auVar94._8_4_;
      auVar188._12_4_ = fVar218 + auVar94._12_4_;
      auVar188._16_4_ = fVar219 + auVar94._16_4_;
      auVar188._20_4_ = fVar220 + auVar94._20_4_;
      auVar188._24_4_ = fVar221 + auVar94._24_4_;
      auVar188._28_4_ = fVar154 + auVar94._28_4_;
      uVar15 = vcmpps_avx512vl(auVar188,auVar153,2);
      uVar79 = (uint)uVar15 & (uint)abStack_180[lVar75];
      bVar72 = (byte)uVar79;
      local_5a8 = uVar69;
      if (uVar79 != 0) {
        auVar189._8_4_ = 0x7f800000;
        auVar189._0_8_ = 0x7f8000007f800000;
        auVar189._12_4_ = 0x7f800000;
        auVar189._16_4_ = 0x7f800000;
        auVar189._20_4_ = 0x7f800000;
        auVar189._24_4_ = 0x7f800000;
        auVar189._28_4_ = 0x7f800000;
        auVar95 = vblendmps_avx512vl(auVar189,auVar94);
        auVar131._0_4_ =
             (uint)(bVar72 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar72 & 1) * (int)auVar94._0_4_;
        bVar76 = (bool)((byte)(uVar79 >> 1) & 1);
        auVar131._4_4_ = (uint)bVar76 * auVar95._4_4_ | (uint)!bVar76 * (int)auVar94._4_4_;
        bVar76 = (bool)((byte)(uVar79 >> 2) & 1);
        auVar131._8_4_ = (uint)bVar76 * auVar95._8_4_ | (uint)!bVar76 * (int)auVar94._8_4_;
        bVar76 = (bool)((byte)(uVar79 >> 3) & 1);
        auVar131._12_4_ = (uint)bVar76 * auVar95._12_4_ | (uint)!bVar76 * (int)auVar94._12_4_;
        bVar76 = (bool)((byte)(uVar79 >> 4) & 1);
        auVar131._16_4_ = (uint)bVar76 * auVar95._16_4_ | (uint)!bVar76 * (int)auVar94._16_4_;
        bVar76 = (bool)((byte)(uVar79 >> 5) & 1);
        auVar131._20_4_ = (uint)bVar76 * auVar95._20_4_ | (uint)!bVar76 * (int)auVar94._20_4_;
        bVar76 = (bool)((byte)(uVar79 >> 6) & 1);
        auVar131._24_4_ = (uint)bVar76 * auVar95._24_4_ | (uint)!bVar76 * (int)auVar94._24_4_;
        auVar131._28_4_ =
             (uVar79 >> 7) * auVar95._28_4_ | (uint)!SUB41(uVar79 >> 7,0) * (int)auVar94._28_4_;
        auVar94 = vshufps_avx(auVar131,auVar131,0xb1);
        auVar94 = vminps_avx(auVar131,auVar94);
        auVar95 = vshufpd_avx(auVar94,auVar94,5);
        auVar94 = vminps_avx(auVar94,auVar95);
        auVar95 = vpermpd_avx2(auVar94,0x4e);
        auVar94 = vminps_avx(auVar94,auVar95);
        uVar15 = vcmpps_avx512vl(auVar131,auVar94,0);
        bVar74 = (byte)uVar15 & bVar72;
        if (bVar74 != 0) {
          uVar79 = (uint)bVar74;
        }
        fVar191 = afStack_140[uVar69 * 0x18 + 1];
        uVar132 = 0;
        for (; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x80000000) {
          uVar132 = uVar132 + 1;
        }
        unaff_R13 = (ulong)auStack_138[uVar69 * 0x18];
        bVar74 = ~('\x01' << ((byte)uVar132 & 0x1f)) & bVar72;
        abStack_180[lVar75] = bVar74;
        auVar203 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                       &
                                                  DAT_3f8000003f800000)))))));
        if (bVar74 != 0) {
          local_5a8 = uVar78 & 0xffffffff;
        }
        fVar230 = afStack_140[uVar69 * 0x18];
        auVar190._4_4_ = fVar230;
        auVar190._0_4_ = fVar230;
        auVar190._8_4_ = fVar230;
        auVar190._12_4_ = fVar230;
        auVar190._16_4_ = fVar230;
        auVar190._20_4_ = fVar230;
        auVar190._24_4_ = fVar230;
        auVar190._28_4_ = fVar230;
        fVar191 = fVar191 - fVar230;
        auVar171._4_4_ = fVar191;
        auVar171._0_4_ = fVar191;
        auVar171._8_4_ = fVar191;
        auVar171._12_4_ = fVar191;
        auVar171._16_4_ = fVar191;
        auVar171._20_4_ = fVar191;
        auVar171._24_4_ = fVar191;
        auVar171._28_4_ = fVar191;
        auVar82 = vfmadd132ps_fma(auVar171,auVar190,_DAT_02020f20);
        _local_320 = ZEXT1632(auVar82);
        local_4d0._8_8_ = 0;
        local_4d0._0_8_ = *(ulong *)(local_320 + (ulong)uVar132 * 4);
        local_818 = unaff_R13;
      }
      uVar78 = local_5a8;
    } while (bVar72 == 0);
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));
         
          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }